

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersector1<8>::
     occluded_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  long lVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [12];
  ulong uVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  byte bVar74;
  uint uVar75;
  undefined1 (*pauVar76) [32];
  uint uVar77;
  uint uVar78;
  ulong uVar79;
  bool bVar80;
  int iVar81;
  ulong uVar82;
  bool bVar83;
  undefined4 uVar84;
  undefined8 uVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar96 [16];
  undefined1 auVar107 [32];
  undefined1 auVar103 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  undefined1 auVar104 [32];
  undefined1 auVar110 [64];
  float fVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar132;
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar124 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar134;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar175;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar176;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [28];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar194;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar208;
  float fVar209;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar202 [32];
  float fVar210;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar221 [16];
  undefined1 auVar226 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar236;
  float fVar237;
  undefined1 in_ZMM10 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  float fVar238;
  undefined1 auVar240 [32];
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar239 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 in_ZMM12 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [64];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_b64;
  int local_ae4;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  RTCFilterFunctionNArguments local_a10;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined8 local_900;
  undefined4 local_8f8;
  float local_8f4;
  undefined4 local_8f0;
  undefined4 local_8ec;
  uint local_8e8;
  uint local_8e4;
  uint local_8e0;
  ulong local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  undefined1 auStack_890 [16];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  undefined1 local_840 [16];
  Primitive *local_830;
  ulong local_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [16];
  undefined1 auStack_770 [16];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  uint uStack_644;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar225 [32];
  undefined1 auVar227 [64];
  
  PVar7 = prim[1];
  uVar79 = (ulong)(byte)PVar7;
  fVar111 = *(float *)(prim + uVar79 * 0x19 + 0x12);
  auVar10 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar79 * 0x19 + 6));
  auVar86._0_4_ = fVar111 * auVar10._0_4_;
  auVar86._4_4_ = fVar111 * auVar10._4_4_;
  auVar86._8_4_ = fVar111 * auVar10._8_4_;
  auVar86._12_4_ = fVar111 * auVar10._12_4_;
  auVar220._0_4_ = fVar111 * (ray->dir).field_0.m128[0];
  auVar220._4_4_ = fVar111 * (ray->dir).field_0.m128[1];
  auVar220._8_4_ = fVar111 * (ray->dir).field_0.m128[2];
  auVar220._12_4_ = fVar111 * (ray->dir).field_0.m128[3];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar79 * 4 + 6);
  auVar97 = vpmovsxbd_avx2(auVar10);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar79 * 5 + 6);
  auVar261 = vpmovsxbd_avx2(auVar93);
  auVar261 = vcvtdq2ps_avx(auVar261);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar79 * 6 + 6);
  auVar145 = vpmovsxbd_avx2(auVar89);
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar200._8_8_ = 0;
  auVar200._0_8_ = *(ulong *)(prim + uVar79 * 0xb + 6);
  auVar13 = vpmovsxbd_avx2(auVar200);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar222._8_8_ = 0;
  auVar222._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  auVar14 = vpmovsxbd_avx2(auVar222);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + (uint)(byte)PVar7 * 0xc + uVar79 + 6);
  auVar170 = vpmovsxbd_avx2(auVar3);
  auVar170 = vcvtdq2ps_avx(auVar170);
  uVar82 = (ulong)(uint)((int)(uVar79 * 9) * 2);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar82 + 6);
  auVar15 = vpmovsxbd_avx2(auVar4);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar82 + uVar79 + 6);
  auVar144 = vpmovsxbd_avx2(auVar5);
  auVar144 = vcvtdq2ps_avx(auVar144);
  uVar82 = (ulong)(uint)((int)(uVar79 * 5) << 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar82 + 6);
  auVar16 = vpmovsxbd_avx2(auVar6);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar169._4_4_ = auVar220._0_4_;
  auVar169._0_4_ = auVar220._0_4_;
  auVar169._8_4_ = auVar220._0_4_;
  auVar169._12_4_ = auVar220._0_4_;
  auVar169._16_4_ = auVar220._0_4_;
  auVar169._20_4_ = auVar220._0_4_;
  auVar169._24_4_ = auVar220._0_4_;
  auVar169._28_4_ = auVar220._0_4_;
  auVar10 = vmovshdup_avx(auVar220);
  uVar85 = auVar10._0_8_;
  auVar259._8_8_ = uVar85;
  auVar259._0_8_ = uVar85;
  auVar259._16_8_ = uVar85;
  auVar259._24_8_ = uVar85;
  auVar10 = vshufps_avx(auVar220,auVar220,0xaa);
  fVar111 = auVar10._0_4_;
  auVar234._0_4_ = fVar111 * auVar145._0_4_;
  fVar132 = auVar10._4_4_;
  auVar234._4_4_ = fVar132 * auVar145._4_4_;
  auVar234._8_4_ = fVar111 * auVar145._8_4_;
  auVar234._12_4_ = fVar132 * auVar145._12_4_;
  auVar234._16_4_ = fVar111 * auVar145._16_4_;
  auVar234._20_4_ = fVar132 * auVar145._20_4_;
  auVar234._28_36_ = in_ZMM12._28_36_;
  auVar234._24_4_ = fVar111 * auVar145._24_4_;
  auVar227._0_4_ = auVar170._0_4_ * fVar111;
  auVar227._4_4_ = auVar170._4_4_ * fVar132;
  auVar227._8_4_ = auVar170._8_4_ * fVar111;
  auVar227._12_4_ = auVar170._12_4_ * fVar132;
  auVar227._16_4_ = auVar170._16_4_ * fVar111;
  auVar227._20_4_ = auVar170._20_4_ * fVar132;
  auVar227._28_36_ = in_ZMM10._28_36_;
  auVar227._24_4_ = auVar170._24_4_ * fVar111;
  auVar232._0_4_ = auVar16._0_4_ * fVar111;
  auVar232._4_4_ = auVar16._4_4_ * fVar132;
  auVar232._8_4_ = auVar16._8_4_ * fVar111;
  auVar232._12_4_ = auVar16._12_4_ * fVar132;
  auVar232._16_4_ = auVar16._16_4_ * fVar111;
  auVar232._20_4_ = auVar16._20_4_ * fVar132;
  auVar232._24_4_ = auVar16._24_4_ * fVar111;
  auVar232._28_4_ = 0;
  auVar10 = vfmadd231ps_fma(auVar234._0_32_,auVar259,auVar261);
  auVar93 = vfmadd231ps_fma(auVar227._0_32_,auVar259,auVar14);
  auVar89 = vfmadd231ps_fma(auVar232,auVar144,auVar259);
  auVar200 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar169,auVar97);
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar169,auVar13);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar15,auVar169);
  auVar168._4_4_ = auVar86._0_4_;
  auVar168._0_4_ = auVar86._0_4_;
  auVar168._8_4_ = auVar86._0_4_;
  auVar168._12_4_ = auVar86._0_4_;
  auVar168._16_4_ = auVar86._0_4_;
  auVar168._20_4_ = auVar86._0_4_;
  auVar168._24_4_ = auVar86._0_4_;
  auVar168._28_4_ = auVar86._0_4_;
  auVar10 = vmovshdup_avx(auVar86);
  uVar85 = auVar10._0_8_;
  auVar260._8_8_ = uVar85;
  auVar260._0_8_ = uVar85;
  auVar260._16_8_ = uVar85;
  auVar260._24_8_ = uVar85;
  auVar10 = vshufps_avx(auVar86,auVar86,0xaa);
  fVar111 = auVar10._0_4_;
  auVar223._0_4_ = fVar111 * auVar145._0_4_;
  fVar132 = auVar10._4_4_;
  auVar223._4_4_ = fVar132 * auVar145._4_4_;
  auVar223._8_4_ = fVar111 * auVar145._8_4_;
  auVar223._12_4_ = fVar132 * auVar145._12_4_;
  auVar223._16_4_ = fVar111 * auVar145._16_4_;
  auVar223._20_4_ = fVar132 * auVar145._20_4_;
  auVar223._24_4_ = fVar111 * auVar145._24_4_;
  auVar223._28_4_ = 0;
  auVar11._4_4_ = auVar170._4_4_ * fVar132;
  auVar11._0_4_ = auVar170._0_4_ * fVar111;
  auVar11._8_4_ = auVar170._8_4_ * fVar111;
  auVar11._12_4_ = auVar170._12_4_ * fVar132;
  auVar11._16_4_ = auVar170._16_4_ * fVar111;
  auVar11._20_4_ = auVar170._20_4_ * fVar132;
  auVar11._24_4_ = auVar170._24_4_ * fVar111;
  auVar11._28_4_ = auVar145._28_4_;
  auVar145._4_4_ = auVar16._4_4_ * fVar132;
  auVar145._0_4_ = auVar16._0_4_ * fVar111;
  auVar145._8_4_ = auVar16._8_4_ * fVar111;
  auVar145._12_4_ = auVar16._12_4_ * fVar132;
  auVar145._16_4_ = auVar16._16_4_ * fVar111;
  auVar145._20_4_ = auVar16._20_4_ * fVar132;
  auVar145._24_4_ = auVar16._24_4_ * fVar111;
  auVar145._28_4_ = fVar132;
  auVar10 = vfmadd231ps_fma(auVar223,auVar260,auVar261);
  auVar222 = vfmadd231ps_fma(auVar11,auVar260,auVar14);
  auVar3 = vfmadd231ps_fma(auVar145,auVar260,auVar144);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar168,auVar97);
  auVar222 = vfmadd231ps_fma(ZEXT1632(auVar222),auVar168,auVar13);
  local_7c0._8_4_ = 0x7fffffff;
  local_7c0._0_8_ = 0x7fffffff7fffffff;
  local_7c0._12_4_ = 0x7fffffff;
  local_7c0._16_4_ = 0x7fffffff;
  local_7c0._20_4_ = 0x7fffffff;
  local_7c0._24_4_ = 0x7fffffff;
  local_7c0._28_4_ = 0x7fffffff;
  auVar98._8_4_ = 0x219392ef;
  auVar98._0_8_ = 0x219392ef219392ef;
  auVar98._12_4_ = 0x219392ef;
  auVar98._16_4_ = 0x219392ef;
  auVar98._20_4_ = 0x219392ef;
  auVar98._24_4_ = 0x219392ef;
  auVar98._28_4_ = 0x219392ef;
  auVar97 = vandps_avx(ZEXT1632(auVar200),local_7c0);
  auVar97 = vcmpps_avx(auVar97,auVar98,1);
  auVar261 = vblendvps_avx(ZEXT1632(auVar200),auVar98,auVar97);
  auVar97 = vandps_avx(ZEXT1632(auVar93),local_7c0);
  auVar97 = vcmpps_avx(auVar97,auVar98,1);
  auVar145 = vblendvps_avx(ZEXT1632(auVar93),auVar98,auVar97);
  auVar97 = vandps_avx(ZEXT1632(auVar89),local_7c0);
  auVar97 = vcmpps_avx(auVar97,auVar98,1);
  auVar97 = vblendvps_avx(ZEXT1632(auVar89),auVar98,auVar97);
  auVar200 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar168,auVar15);
  auVar13 = vrcpps_avx(auVar261);
  auVar202._8_4_ = 0x3f800000;
  auVar202._0_8_ = 0x3f8000003f800000;
  auVar202._12_4_ = 0x3f800000;
  auVar202._16_4_ = 0x3f800000;
  auVar202._20_4_ = 0x3f800000;
  auVar202._24_4_ = 0x3f800000;
  auVar202._28_4_ = 0x3f800000;
  auVar10 = vfnmadd213ps_fma(auVar261,auVar13,auVar202);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar13,auVar13);
  auVar261 = vrcpps_avx(auVar145);
  auVar93 = vfnmadd213ps_fma(auVar145,auVar261,auVar202);
  auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar261,auVar261);
  auVar261 = vrcpps_avx(auVar97);
  auVar89 = vfnmadd213ps_fma(auVar97,auVar261,auVar202);
  auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar261,auVar261);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 7 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar4));
  auVar13._4_4_ = auVar10._4_4_ * auVar97._4_4_;
  auVar13._0_4_ = auVar10._0_4_ * auVar97._0_4_;
  auVar13._8_4_ = auVar10._8_4_ * auVar97._8_4_;
  auVar13._12_4_ = auVar10._12_4_ * auVar97._12_4_;
  auVar13._16_4_ = auVar97._16_4_ * 0.0;
  auVar13._20_4_ = auVar97._20_4_ * 0.0;
  auVar13._24_4_ = auVar97._24_4_ * 0.0;
  auVar13._28_4_ = auVar97._28_4_;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 9 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar4));
  auVar14._4_4_ = auVar10._4_4_ * auVar97._4_4_;
  auVar14._0_4_ = auVar10._0_4_ * auVar97._0_4_;
  auVar14._8_4_ = auVar10._8_4_ * auVar97._8_4_;
  auVar14._12_4_ = auVar10._12_4_ * auVar97._12_4_;
  auVar14._16_4_ = auVar97._16_4_ * 0.0;
  auVar14._20_4_ = auVar97._20_4_ * 0.0;
  auVar14._24_4_ = auVar97._24_4_ * 0.0;
  auVar14._28_4_ = auVar97._28_4_;
  auVar124._1_3_ = 0;
  auVar124[0] = PVar7;
  auVar261 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar7 * 0x10 + uVar79 * -2 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar222));
  auVar170._4_4_ = auVar97._4_4_ * auVar93._4_4_;
  auVar170._0_4_ = auVar97._0_4_ * auVar93._0_4_;
  auVar170._8_4_ = auVar97._8_4_ * auVar93._8_4_;
  auVar170._12_4_ = auVar97._12_4_ * auVar93._12_4_;
  auVar170._16_4_ = auVar97._16_4_ * 0.0;
  auVar170._20_4_ = auVar97._20_4_ * 0.0;
  auVar170._24_4_ = auVar97._24_4_ * 0.0;
  auVar170._28_4_ = auVar97._28_4_;
  auVar97 = vcvtdq2ps_avx(auVar261);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar222));
  auVar15._4_4_ = auVar93._4_4_ * auVar97._4_4_;
  auVar15._0_4_ = auVar93._0_4_ * auVar97._0_4_;
  auVar15._8_4_ = auVar93._8_4_ * auVar97._8_4_;
  auVar15._12_4_ = auVar93._12_4_ * auVar97._12_4_;
  auVar15._16_4_ = auVar97._16_4_ * 0.0;
  auVar15._20_4_ = auVar97._20_4_ * 0.0;
  auVar15._24_4_ = auVar97._24_4_ * 0.0;
  auVar15._28_4_ = auVar97._28_4_;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 + uVar79 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar200));
  auVar144._4_4_ = auVar97._4_4_ * auVar89._4_4_;
  auVar144._0_4_ = auVar97._0_4_ * auVar89._0_4_;
  auVar144._8_4_ = auVar97._8_4_ * auVar89._8_4_;
  auVar144._12_4_ = auVar97._12_4_ * auVar89._12_4_;
  auVar144._16_4_ = auVar97._16_4_ * 0.0;
  auVar144._20_4_ = auVar97._20_4_ * 0.0;
  auVar144._24_4_ = auVar97._24_4_ * 0.0;
  auVar144._28_4_ = auVar97._28_4_;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x17 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar200));
  auVar16._4_4_ = auVar89._4_4_ * auVar97._4_4_;
  auVar16._0_4_ = auVar89._0_4_ * auVar97._0_4_;
  auVar16._8_4_ = auVar89._8_4_ * auVar97._8_4_;
  auVar16._12_4_ = auVar89._12_4_ * auVar97._12_4_;
  auVar16._16_4_ = auVar97._16_4_ * 0.0;
  auVar16._20_4_ = auVar97._20_4_ * 0.0;
  auVar16._24_4_ = auVar97._24_4_ * 0.0;
  auVar16._28_4_ = auVar97._28_4_;
  auVar97 = vpminsd_avx2(auVar13,auVar14);
  auVar261 = vpminsd_avx2(auVar170,auVar15);
  auVar97 = vmaxps_avx(auVar97,auVar261);
  uVar84 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar224._4_4_ = uVar84;
  auVar224._0_4_ = uVar84;
  auVar224._8_4_ = uVar84;
  auVar224._12_4_ = uVar84;
  auVar224._16_4_ = uVar84;
  auVar224._20_4_ = uVar84;
  auVar224._24_4_ = uVar84;
  auVar224._28_4_ = uVar84;
  auVar261 = vpminsd_avx2(auVar144,auVar16);
  auVar261 = vmaxps_avx(auVar261,auVar224);
  auVar97 = vmaxps_avx(auVar97,auVar261);
  local_340._4_4_ = auVar97._4_4_ * 0.99999964;
  local_340._0_4_ = auVar97._0_4_ * 0.99999964;
  local_340._8_4_ = auVar97._8_4_ * 0.99999964;
  local_340._12_4_ = auVar97._12_4_ * 0.99999964;
  local_340._16_4_ = auVar97._16_4_ * 0.99999964;
  local_340._20_4_ = auVar97._20_4_ * 0.99999964;
  local_340._24_4_ = auVar97._24_4_ * 0.99999964;
  local_340._28_4_ = auVar261._28_4_;
  auVar97 = vpmaxsd_avx2(auVar13,auVar14);
  auVar261 = vpmaxsd_avx2(auVar170,auVar15);
  auVar97 = vminps_avx(auVar97,auVar261);
  auVar261 = vpmaxsd_avx2(auVar144,auVar16);
  fVar111 = ray->tfar;
  auVar142._4_4_ = fVar111;
  auVar142._0_4_ = fVar111;
  auVar142._8_4_ = fVar111;
  auVar142._12_4_ = fVar111;
  auVar142._16_4_ = fVar111;
  auVar142._20_4_ = fVar111;
  auVar142._24_4_ = fVar111;
  auVar142._28_4_ = fVar111;
  auVar261 = vminps_avx(auVar261,auVar142);
  auVar97 = vminps_avx(auVar97,auVar261);
  auVar12._4_4_ = auVar97._4_4_ * 1.0000004;
  auVar12._0_4_ = auVar97._0_4_ * 1.0000004;
  auVar12._8_4_ = auVar97._8_4_ * 1.0000004;
  auVar12._12_4_ = auVar97._12_4_ * 1.0000004;
  auVar12._16_4_ = auVar97._16_4_ * 1.0000004;
  auVar12._20_4_ = auVar97._20_4_ * 1.0000004;
  auVar12._24_4_ = auVar97._24_4_ * 1.0000004;
  auVar12._28_4_ = auVar97._28_4_;
  auVar124[4] = PVar7;
  auVar124._5_3_ = 0;
  auVar124[8] = PVar7;
  auVar124._9_3_ = 0;
  auVar124[0xc] = PVar7;
  auVar124._13_3_ = 0;
  auVar124[0x10] = PVar7;
  auVar124._17_3_ = 0;
  auVar124[0x14] = PVar7;
  auVar124._21_3_ = 0;
  auVar124[0x18] = PVar7;
  auVar124._25_3_ = 0;
  auVar124[0x1c] = PVar7;
  auVar124._29_3_ = 0;
  auVar261 = vpcmpgtd_avx2(auVar124,_DAT_01fe9900);
  auVar97 = vcmpps_avx(local_340,auVar12,2);
  auVar97 = vandps_avx(auVar97,auVar261);
  uVar75 = vmovmskps_avx(auVar97);
  if (uVar75 == 0) {
    return false;
  }
  uVar75 = uVar75 & 0xff;
  auVar97._16_16_ = mm_lookupmask_ps._240_16_;
  auVar97._0_16_ = mm_lookupmask_ps._240_16_;
  local_6a0 = vblendps_avx(auVar97,ZEXT832(0) << 0x20,0x80);
  local_660 = 0x80000000;
  uStack_65c = 0x80000000;
  uStack_658 = 0x80000000;
  uStack_654 = 0x80000000;
  fStack_650 = -0.0;
  fStack_64c = -0.0;
  fStack_648 = -0.0;
  uStack_644 = 0x80000000;
  local_830 = prim;
LAB_0180756c:
  lVar18 = 0;
  local_828 = (ulong)uVar75;
  for (uVar82 = local_828; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
    lVar18 = lVar18 + 1;
  }
  uVar75 = *(uint *)(local_830 + 2);
  local_8c8 = (ulong)*(uint *)(local_830 + lVar18 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar75].ptr;
  uVar82 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_8c8);
  p_Var9 = pGVar8[1].intersectionFilterN;
  lVar18 = *(long *)&pGVar8[1].time_range.upper;
  auVar10 = *(undefined1 (*) [16])(lVar18 + (long)p_Var9 * uVar82);
  auVar93 = *(undefined1 (*) [16])(lVar18 + (uVar82 + 1) * (long)p_Var9);
  auVar89 = *(undefined1 (*) [16])(lVar18 + (uVar82 + 2) * (long)p_Var9);
  local_828 = local_828 - 1 & local_828;
  auVar200 = *(undefined1 (*) [16])(lVar18 + (uVar82 + 3) * (long)p_Var9);
  if (local_828 != 0) {
    uVar79 = local_828 - 1 & local_828;
    for (uVar82 = local_828; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
    }
    if (uVar79 != 0) {
      for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar195._0_4_ = (auVar10._0_4_ + auVar93._0_4_ + auVar89._0_4_ + auVar200._0_4_) * 0.25;
  auVar195._4_4_ = (auVar10._4_4_ + auVar93._4_4_ + auVar89._4_4_ + auVar200._4_4_) * 0.25;
  auVar195._8_4_ = (auVar10._8_4_ + auVar93._8_4_ + auVar89._8_4_ + auVar200._8_4_) * 0.25;
  auVar195._12_4_ = (auVar10._12_4_ + auVar93._12_4_ + auVar89._12_4_ + auVar200._12_4_) * 0.25;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar222 = vsubps_avx(auVar195,(undefined1  [16])aVar1);
  auVar222 = vdpps_avx(auVar222,(undefined1  [16])aVar2,0x7f);
  auVar3 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar4 = vrcpss_avx(auVar3,auVar3);
  auVar3 = vfnmadd213ss_fma(auVar4,auVar3,ZEXT416(0x40000000));
  fVar111 = auVar222._0_4_ * auVar4._0_4_ * auVar3._0_4_;
  local_840 = ZEXT416((uint)fVar111);
  auVar196._4_4_ = fVar111;
  auVar196._0_4_ = fVar111;
  auVar196._8_4_ = fVar111;
  auVar196._12_4_ = fVar111;
  fStack_870 = fVar111;
  _local_880 = auVar196;
  fStack_86c = fVar111;
  fStack_868 = fVar111;
  fStack_864 = fVar111;
  auVar222 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar196);
  auVar222 = vblendps_avx(auVar222,_DAT_01f7aa10,8);
  local_a20 = vsubps_avx(auVar10,auVar222);
  local_a30 = vsubps_avx(auVar89,auVar222);
  local_a40 = vsubps_avx(auVar93,auVar222);
  _local_a50 = vsubps_avx(auVar200,auVar222);
  auVar10 = vmovshdup_avx(local_a20);
  local_1e0 = auVar10._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar10 = vshufps_avx(local_a20,local_a20,0xaa);
  local_200 = auVar10._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar10 = vshufps_avx(local_a20,local_a20,0xff);
  uVar85 = auVar10._0_8_;
  auVar261._8_8_ = uVar85;
  auVar261._0_8_ = uVar85;
  auVar261._16_8_ = uVar85;
  auVar261._24_8_ = uVar85;
  auVar10 = vmovshdup_avx(local_a40);
  local_220 = auVar10._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar10 = vshufps_avx(local_a40,local_a40,0xaa);
  uVar85 = auVar10._0_8_;
  local_a80._8_8_ = uVar85;
  local_a80._0_8_ = uVar85;
  local_a80._16_8_ = uVar85;
  local_a80._24_8_ = uVar85;
  auVar258 = ZEXT3264(local_a80);
  auVar10 = vshufps_avx(local_a40,local_a40,0xff);
  uVar85 = auVar10._0_8_;
  local_920._8_8_ = uVar85;
  local_920._0_8_ = uVar85;
  local_920._16_8_ = uVar85;
  local_920._24_8_ = uVar85;
  auVar250 = ZEXT3264(local_920);
  auVar10 = vmovshdup_avx(local_a30);
  uVar85 = auVar10._0_8_;
  auVar221._8_8_ = uVar85;
  auVar221._0_8_ = uVar85;
  auVar225._16_8_ = uVar85;
  auVar225._0_16_ = auVar221;
  auVar225._24_8_ = uVar85;
  auVar227 = ZEXT3264(auVar225);
  auVar93 = vshufps_avx(local_a30,local_a30,0xaa);
  local_3c0 = auVar93._0_4_;
  fStack_3bc = auVar93._4_4_;
  auVar93 = vshufps_avx(local_a30,local_a30,0xff);
  local_3e0 = auVar93._0_4_;
  fStack_3dc = auVar93._4_4_;
  auVar93 = vmovshdup_avx(_local_a50);
  local_240 = auVar93._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar93 = vshufps_avx(_local_a50,_local_a50,0xaa);
  local_260 = auVar93._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar93 = vshufps_avx(_local_a50,_local_a50,0xff);
  local_280 = auVar93._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar87._0_4_ = aVar2.x * aVar2.x;
  auVar87._4_4_ = aVar2.y * aVar2.y;
  auVar87._8_4_ = aVar2.z * aVar2.z;
  auVar87._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar93 = vshufps_avx(auVar87,auVar87,0xaa);
  uVar84 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_680._4_4_ = uVar84;
  local_680._0_4_ = uVar84;
  fStack_678 = (float)uVar84;
  fStack_674 = (float)uVar84;
  fStack_670 = (float)uVar84;
  fStack_66c = (float)uVar84;
  fStack_668 = (float)uVar84;
  register0x0000149c = uVar84;
  auVar234 = ZEXT3264(_local_680);
  uVar85 = auVar93._0_8_;
  auVar239._8_8_ = uVar85;
  auVar239._0_8_ = uVar85;
  auVar239._16_8_ = uVar85;
  auVar239._24_8_ = uVar85;
  auVar93 = vfmadd231ps_fma(auVar239,_local_680,_local_680);
  uVar84 = *(undefined4 *)&(ray->dir).field_0;
  local_500._4_4_ = uVar84;
  local_500._0_4_ = uVar84;
  fStack_4f8 = (float)uVar84;
  fStack_4f4 = (float)uVar84;
  fStack_4f0 = (float)uVar84;
  fStack_4ec = (float)uVar84;
  fStack_4e8 = (float)uVar84;
  register0x0000121c = uVar84;
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),_local_500,_local_500);
  auVar242 = ZEXT1664(auVar93);
  local_b64 = 1;
  uVar82 = 0;
  bVar80 = false;
  local_520 = (ray->dir).field_0.m128[2];
  uVar84 = local_a20._0_4_;
  local_2c0._4_4_ = uVar84;
  local_2c0._0_4_ = uVar84;
  local_2c0._8_4_ = uVar84;
  local_2c0._12_4_ = uVar84;
  local_2c0._16_4_ = uVar84;
  local_2c0._20_4_ = uVar84;
  local_2c0._24_4_ = uVar84;
  local_2c0._28_4_ = uVar84;
  uVar84 = local_a40._0_4_;
  local_2e0._4_4_ = uVar84;
  local_2e0._0_4_ = uVar84;
  local_2e0._8_4_ = uVar84;
  local_2e0._12_4_ = uVar84;
  local_2e0._16_4_ = uVar84;
  local_2e0._20_4_ = uVar84;
  local_2e0._24_4_ = uVar84;
  local_2e0._28_4_ = uVar84;
  uVar84 = local_a30._0_4_;
  local_300._4_4_ = uVar84;
  local_300._0_4_ = uVar84;
  local_300._8_4_ = uVar84;
  local_300._12_4_ = uVar84;
  local_300._16_4_ = uVar84;
  local_300._20_4_ = uVar84;
  local_300._24_4_ = uVar84;
  local_300._28_4_ = uVar84;
  local_320 = local_a50._0_4_;
  local_420 = vandps_avx(ZEXT1632(auVar93),local_7c0);
  local_4b0 = ZEXT816(0x3f80000000000000);
  local_2a0 = ZEXT1632(auVar93);
  local_400 = auVar261;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  fStack_51c = local_520;
  fStack_518 = local_520;
  fStack_514 = local_520;
  fStack_510 = local_520;
  fStack_50c = local_520;
  fStack_508 = local_520;
  fStack_504 = local_520;
  fStack_3d8 = local_3e0;
  fStack_3d4 = fStack_3dc;
  fStack_3d0 = local_3e0;
  fStack_3cc = fStack_3dc;
  fStack_3c8 = local_3e0;
  fStack_3c4 = fStack_3dc;
  fStack_3b8 = local_3c0;
  fStack_3b4 = fStack_3bc;
  fStack_3b0 = local_3c0;
  fStack_3ac = fStack_3bc;
  fStack_3a8 = local_3c0;
  fStack_3a4 = fStack_3bc;
  do {
    auVar165._8_4_ = 0x3f800000;
    auVar165._0_8_ = 0x3f8000003f800000;
    auVar165._12_4_ = 0x3f800000;
    auVar165._16_4_ = 0x3f800000;
    auVar165._20_4_ = 0x3f800000;
    iVar81 = (int)uVar82;
    auVar165._24_4_ = 0x3f800000;
    auVar165._28_4_ = 0x3f800000;
    auVar93 = vmovshdup_avx(local_4b0);
    auVar93 = vsubps_avx(auVar93,local_4b0);
    fVar135 = auVar93._0_4_;
    fVar137 = fVar135 * 0.04761905;
    local_720._0_4_ = local_4b0._0_4_;
    local_720._4_4_ = local_720._0_4_;
    local_720._8_4_ = local_720._0_4_;
    local_720._12_4_ = local_720._0_4_;
    local_720._16_4_ = local_720._0_4_;
    local_720._20_4_ = local_720._0_4_;
    local_720._24_4_ = local_720._0_4_;
    local_720._28_4_ = local_720._0_4_;
    local_740._4_4_ = fVar135;
    local_740._0_4_ = fVar135;
    local_740._8_4_ = fVar135;
    local_740._12_4_ = fVar135;
    local_740._16_4_ = fVar135;
    local_740._20_4_ = fVar135;
    local_740._24_4_ = fVar135;
    local_740._28_4_ = fVar135;
    auVar93 = vfmadd231ps_fma(local_720,local_740,_DAT_01faff20);
    auVar97 = vsubps_avx(auVar165,ZEXT1632(auVar93));
    fVar111 = auVar93._0_4_;
    auVar243._0_4_ = local_2e0._0_4_ * fVar111;
    fVar132 = auVar93._4_4_;
    auVar243._4_4_ = local_2e0._4_4_ * fVar132;
    fVar133 = auVar93._8_4_;
    auVar243._8_4_ = local_2e0._8_4_ * fVar133;
    fVar134 = auVar93._12_4_;
    auVar243._12_4_ = local_2e0._12_4_ * fVar134;
    auVar243._16_4_ = local_2e0._16_4_ * 0.0;
    auVar243._20_4_ = local_2e0._20_4_ * 0.0;
    auVar243._28_36_ = auVar242._28_36_;
    auVar243._24_4_ = local_2e0._24_4_ * 0.0;
    auVar69._8_8_ = uStack_218;
    auVar69._0_8_ = local_220;
    auVar69._16_8_ = uStack_210;
    auVar69._24_8_ = uStack_208;
    auVar235._0_4_ = (float)local_220 * fVar111;
    auVar235._4_4_ = (float)((ulong)local_220 >> 0x20) * fVar132;
    auVar235._8_4_ = (float)uStack_218 * fVar133;
    auVar235._12_4_ = (float)((ulong)uStack_218 >> 0x20) * fVar134;
    auVar235._16_4_ = (float)uStack_210 * 0.0;
    auVar235._20_4_ = (float)((ulong)uStack_210 >> 0x20) * 0.0;
    auVar235._28_36_ = auVar234._28_36_;
    auVar235._24_4_ = (float)uStack_208 * 0.0;
    auVar242._0_4_ = auVar258._0_4_ * fVar111;
    auVar242._4_4_ = auVar258._4_4_ * fVar132;
    auVar242._8_4_ = auVar258._8_4_ * fVar133;
    auVar242._12_4_ = auVar258._12_4_ * fVar134;
    auVar242._16_4_ = auVar258._16_4_ * 0.0;
    auVar242._20_4_ = auVar258._20_4_ * 0.0;
    auVar242._28_36_ = auVar227._28_36_;
    auVar242._24_4_ = auVar258._24_4_ * 0.0;
    auVar19._4_4_ = auVar250._4_4_ * fVar132;
    auVar19._0_4_ = auVar250._0_4_ * fVar111;
    auVar19._8_4_ = auVar250._8_4_ * fVar133;
    auVar19._12_4_ = auVar250._12_4_ * fVar134;
    auVar19._16_4_ = auVar250._16_4_ * 0.0;
    auVar19._20_4_ = auVar250._20_4_ * 0.0;
    auVar19._24_4_ = auVar250._24_4_ * 0.0;
    auVar19._28_4_ = fVar135;
    auVar93 = vfmadd231ps_fma(auVar243._0_32_,auVar97,local_2c0);
    auVar71._8_8_ = uStack_1d8;
    auVar71._0_8_ = local_1e0;
    auVar71._16_8_ = uStack_1d0;
    auVar71._24_8_ = uStack_1c8;
    auVar89 = vfmadd231ps_fma(auVar235._0_32_,auVar97,auVar71);
    auVar70._8_8_ = uStack_1f8;
    auVar70._0_8_ = local_200;
    auVar70._16_8_ = uStack_1f0;
    auVar70._24_8_ = uStack_1e8;
    auVar200 = vfmadd231ps_fma(auVar242._0_32_,auVar97,auVar70);
    auVar222 = vfmadd231ps_fma(auVar19,auVar97,auVar261);
    auVar20._4_4_ = local_300._4_4_ * fVar132;
    auVar20._0_4_ = local_300._0_4_ * fVar111;
    auVar20._8_4_ = local_300._8_4_ * fVar133;
    auVar20._12_4_ = local_300._12_4_ * fVar134;
    auVar20._16_4_ = local_300._16_4_ * 0.0;
    auVar20._20_4_ = local_300._20_4_ * 0.0;
    auVar20._24_4_ = local_300._24_4_ * 0.0;
    auVar20._28_4_ = local_2c0._28_4_;
    fVar135 = auVar10._0_4_;
    fVar136 = auVar10._4_4_;
    auVar21._4_4_ = fVar136 * fVar132;
    auVar21._0_4_ = fVar135 * fVar111;
    auVar21._8_4_ = fVar135 * fVar133;
    auVar21._12_4_ = fVar136 * fVar134;
    auVar21._16_4_ = fVar135 * 0.0;
    auVar21._20_4_ = fVar136 * 0.0;
    auVar21._24_4_ = fVar135 * 0.0;
    auVar21._28_4_ = local_300._28_4_;
    auVar72._4_4_ = fVar132 * fStack_3bc;
    auVar72._0_4_ = fVar111 * local_3c0;
    auVar72._8_4_ = fVar133 * fStack_3b8;
    auVar72._12_4_ = fVar134 * fStack_3b4;
    auVar72._16_4_ = fStack_3b0 * 0.0;
    auVar72._20_4_ = fStack_3ac * 0.0;
    auVar72._24_4_ = fStack_3a8 * 0.0;
    auVar72._28_4_ = DAT_01faff20._28_4_;
    auVar22._4_4_ = fVar132 * fStack_3dc;
    auVar22._0_4_ = fVar111 * local_3e0;
    auVar22._8_4_ = fVar133 * fStack_3d8;
    auVar22._12_4_ = fVar134 * fStack_3d4;
    auVar22._16_4_ = fStack_3d0 * 0.0;
    auVar22._20_4_ = fStack_3cc * 0.0;
    uVar84 = (undefined4)((ulong)uStack_208 >> 0x20);
    auVar22._24_4_ = fStack_3c8 * 0.0;
    auVar22._28_4_ = uVar84;
    auVar3 = vfmadd231ps_fma(auVar20,auVar97,local_2e0);
    auVar4 = vfmadd231ps_fma(auVar21,auVar97,auVar69);
    auVar5 = vfmadd231ps_fma(auVar72,auVar97,auVar258._0_32_);
    auVar6 = vfmadd231ps_fma(auVar22,auVar97,auVar250._0_32_);
    auVar23._4_4_ = fStack_31c * fVar132;
    auVar23._0_4_ = local_320 * fVar111;
    auVar23._8_4_ = fStack_318 * fVar133;
    auVar23._12_4_ = fStack_314 * fVar134;
    auVar23._16_4_ = fStack_310 * 0.0;
    auVar23._20_4_ = fStack_30c * 0.0;
    auVar23._24_4_ = fStack_308 * 0.0;
    auVar23._28_4_ = fStack_304;
    auVar251._0_4_ = fVar111 * (float)local_240;
    auVar251._4_4_ = fVar132 * local_240._4_4_;
    auVar251._8_4_ = fVar133 * (float)uStack_238;
    auVar251._12_4_ = fVar134 * uStack_238._4_4_;
    auVar251._16_4_ = (float)uStack_230 * 0.0;
    auVar251._20_4_ = uStack_230._4_4_ * 0.0;
    auVar251._28_36_ = auVar250._28_36_;
    auVar251._24_4_ = (float)uStack_228 * 0.0;
    auVar73._28_4_ = fVar136;
    auVar73._0_28_ =
         ZEXT1628(CONCAT412(auVar3._12_4_ * fVar134,
                            CONCAT48(auVar3._8_4_ * fVar133,
                                     CONCAT44(auVar3._4_4_ * fVar132,auVar3._0_4_ * fVar111))));
    auVar93 = vfmadd231ps_fma(auVar73,auVar97,ZEXT1632(auVar93));
    auVar89 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar134 * auVar4._12_4_,
                                                 CONCAT48(fVar133 * auVar4._8_4_,
                                                          CONCAT44(fVar132 * auVar4._4_4_,
                                                                   fVar111 * auVar4._0_4_)))),
                              auVar97,ZEXT1632(auVar89));
    auVar200 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar134 * auVar5._12_4_,
                                                  CONCAT48(fVar133 * auVar5._8_4_,
                                                           CONCAT44(fVar132 * auVar5._4_4_,
                                                                    fVar111 * auVar5._0_4_)))),
                               auVar97,ZEXT1632(auVar200));
    auVar24._28_4_ = local_2e0._28_4_;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(fVar134 * auVar6._12_4_,
                            CONCAT48(fVar133 * auVar6._8_4_,
                                     CONCAT44(fVar132 * auVar6._4_4_,fVar111 * auVar6._0_4_))));
    auVar222 = vfmadd231ps_fma(auVar24,auVar97,ZEXT1632(auVar222));
    auVar226._0_4_ = fVar111 * (float)local_260;
    auVar226._4_4_ = fVar132 * local_260._4_4_;
    auVar226._8_4_ = fVar133 * (float)uStack_258;
    auVar226._12_4_ = fVar134 * uStack_258._4_4_;
    auVar226._16_4_ = (float)uStack_250 * 0.0;
    auVar226._20_4_ = uStack_250._4_4_ * 0.0;
    auVar226._24_4_ = (float)uStack_248 * 0.0;
    auVar226._28_4_ = 0;
    auVar86 = vfmadd231ps_fma(auVar23,auVar97,local_300);
    auVar3 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar86._12_4_ * fVar134,
                                                CONCAT48(auVar86._8_4_ * fVar133,
                                                         CONCAT44(auVar86._4_4_ * fVar132,
                                                                  auVar86._0_4_ * fVar111)))),
                             auVar97,ZEXT1632(auVar3));
    auVar228._0_4_ = fVar111 * (float)local_280;
    auVar228._4_4_ = fVar132 * local_280._4_4_;
    auVar228._8_4_ = fVar133 * (float)uStack_278;
    auVar228._12_4_ = fVar134 * uStack_278._4_4_;
    auVar228._16_4_ = (float)uStack_270 * 0.0;
    auVar228._20_4_ = uStack_270._4_4_ * 0.0;
    auVar228._24_4_ = (float)uStack_268 * 0.0;
    auVar228._28_4_ = 0;
    auVar86 = vfmadd231ps_fma(auVar251._0_32_,auVar97,auVar225);
    auVar67._4_4_ = fStack_3bc;
    auVar67._0_4_ = local_3c0;
    auVar67._8_4_ = fStack_3b8;
    auVar67._12_4_ = fStack_3b4;
    auVar67._16_4_ = fStack_3b0;
    auVar67._20_4_ = fStack_3ac;
    auVar67._24_4_ = fStack_3a8;
    auVar67._28_4_ = fStack_3a4;
    auVar220 = vfmadd231ps_fma(auVar226,auVar97,auVar67);
    auVar66._4_4_ = fStack_3dc;
    auVar66._0_4_ = local_3e0;
    auVar66._8_4_ = fStack_3d8;
    auVar66._12_4_ = fStack_3d4;
    auVar66._16_4_ = fStack_3d0;
    auVar66._20_4_ = fStack_3cc;
    auVar66._24_4_ = fStack_3c8;
    auVar66._28_4_ = fStack_3c4;
    auVar87 = vfmadd231ps_fma(auVar228,auVar97,auVar66);
    auVar250._28_36_ = auVar258._28_36_;
    auVar250._0_28_ =
         ZEXT1628(CONCAT412(auVar87._12_4_ * fVar134,
                            CONCAT48(auVar87._8_4_ * fVar133,
                                     CONCAT44(auVar87._4_4_ * fVar132,auVar87._0_4_ * fVar111))));
    auVar4 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar86._12_4_ * fVar134,
                                                CONCAT48(auVar86._8_4_ * fVar133,
                                                         CONCAT44(auVar86._4_4_ * fVar132,
                                                                  auVar86._0_4_ * fVar111)))),
                             auVar97,ZEXT1632(auVar4));
    auVar5 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar134 * auVar220._12_4_,
                                                CONCAT48(fVar133 * auVar220._8_4_,
                                                         CONCAT44(fVar132 * auVar220._4_4_,
                                                                  fVar111 * auVar220._0_4_)))),
                             auVar97,ZEXT1632(auVar5));
    auVar6 = vfmadd231ps_fma(auVar250._0_32_,auVar97,ZEXT1632(auVar6));
    auVar25._28_4_ = local_300._28_4_;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(auVar4._12_4_ * fVar134,
                            CONCAT48(auVar4._8_4_ * fVar133,
                                     CONCAT44(auVar4._4_4_ * fVar132,auVar4._0_4_ * fVar111))));
    auVar26._28_4_ = uVar84;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(fVar134 * auVar5._12_4_,
                            CONCAT48(fVar133 * auVar5._8_4_,
                                     CONCAT44(fVar132 * auVar5._4_4_,fVar111 * auVar5._0_4_))));
    auVar86 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar3._12_4_ * fVar134,
                                                 CONCAT48(auVar3._8_4_ * fVar133,
                                                          CONCAT44(auVar3._4_4_ * fVar132,
                                                                   auVar3._0_4_ * fVar111)))),
                              auVar97,ZEXT1632(auVar93));
    auVar220 = vfmadd231ps_fma(auVar25,auVar97,ZEXT1632(auVar89));
    auVar98 = ZEXT1632(auVar220);
    auVar220 = vfmadd231ps_fma(auVar26,auVar97,ZEXT1632(auVar200));
    auVar87 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar6._12_4_ * fVar134,
                                                 CONCAT48(auVar6._8_4_ * fVar133,
                                                          CONCAT44(auVar6._4_4_ * fVar132,
                                                                   auVar6._0_4_ * fVar111)))),
                              ZEXT1632(auVar222),auVar97);
    auVar261 = vsubps_avx(ZEXT1632(auVar3),ZEXT1632(auVar93));
    auVar97 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar89));
    auVar145 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar200));
    auVar13 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar222));
    fVar194 = fVar137 * auVar261._0_4_ * 3.0;
    fVar208 = fVar137 * auVar261._4_4_ * 3.0;
    local_6e0._4_4_ = fVar208;
    local_6e0._0_4_ = fVar194;
    fVar209 = fVar137 * auVar261._8_4_ * 3.0;
    local_6e0._8_4_ = fVar209;
    fVar210 = fVar137 * auVar261._12_4_ * 3.0;
    local_6e0._12_4_ = fVar210;
    fVar211 = fVar137 * auVar261._16_4_ * 3.0;
    local_6e0._16_4_ = fVar211;
    fVar212 = fVar137 * auVar261._20_4_ * 3.0;
    local_6e0._20_4_ = fVar212;
    fVar213 = fVar137 * auVar261._24_4_ * 3.0;
    local_6e0._24_4_ = fVar213;
    local_6e0._28_4_ = 0x40400000;
    local_980._0_4_ = fVar137 * auVar97._0_4_ * 3.0;
    local_980._4_4_ = fVar137 * auVar97._4_4_ * 3.0;
    local_980._8_4_ = fVar137 * auVar97._8_4_ * 3.0;
    local_980._12_4_ = fVar137 * auVar97._12_4_ * 3.0;
    local_980._16_4_ = fVar137 * auVar97._16_4_ * 3.0;
    local_980._20_4_ = fVar137 * auVar97._20_4_ * 3.0;
    local_980._24_4_ = fVar137 * auVar97._24_4_ * 3.0;
    local_980._28_4_ = 0;
    local_aa0._0_4_ = fVar137 * auVar145._0_4_ * 3.0;
    local_aa0._4_4_ = fVar137 * auVar145._4_4_ * 3.0;
    local_aa0._8_4_ = fVar137 * auVar145._8_4_ * 3.0;
    local_aa0._12_4_ = fVar137 * auVar145._12_4_ * 3.0;
    local_aa0._16_4_ = fVar137 * auVar145._16_4_ * 3.0;
    local_aa0._20_4_ = fVar137 * auVar145._20_4_ * 3.0;
    local_aa0._24_4_ = fVar137 * auVar145._24_4_ * 3.0;
    local_aa0._28_4_ = 0;
    fVar111 = fVar137 * auVar13._0_4_ * 3.0;
    fVar132 = fVar137 * auVar13._4_4_ * 3.0;
    auVar27._4_4_ = fVar132;
    auVar27._0_4_ = fVar111;
    fVar133 = fVar137 * auVar13._8_4_ * 3.0;
    auVar27._8_4_ = fVar133;
    fVar134 = fVar137 * auVar13._12_4_ * 3.0;
    auVar27._12_4_ = fVar134;
    fVar135 = fVar137 * auVar13._16_4_ * 3.0;
    auVar27._16_4_ = fVar135;
    fVar136 = fVar137 * auVar13._20_4_ * 3.0;
    auVar27._20_4_ = fVar136;
    fVar137 = fVar137 * auVar13._24_4_ * 3.0;
    auVar27._24_4_ = fVar137;
    auVar27._28_4_ = auVar261._28_4_;
    local_ae0 = ZEXT1632(auVar86);
    auVar124 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar86));
    auVar142 = vpermps_avx2(_DAT_01fec480,auVar98);
    local_960 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar220));
    auVar14 = vsubps_avx(auVar124,local_ae0);
    auVar170 = vsubps_avx(local_960,ZEXT1632(auVar220));
    fVar175 = auVar170._0_4_;
    fVar176 = auVar170._4_4_;
    auVar28._4_4_ = fVar176 * fVar208;
    auVar28._0_4_ = fVar175 * fVar194;
    fVar194 = auVar170._8_4_;
    auVar28._8_4_ = fVar194 * fVar209;
    fVar208 = auVar170._12_4_;
    auVar28._12_4_ = fVar208 * fVar210;
    fVar209 = auVar170._16_4_;
    auVar28._16_4_ = fVar209 * fVar211;
    fVar210 = auVar170._20_4_;
    auVar28._20_4_ = fVar210 * fVar212;
    fVar211 = auVar170._24_4_;
    auVar28._24_4_ = fVar211 * fVar213;
    auVar28._28_4_ = auVar124._28_4_;
    auVar93 = vfmsub231ps_fma(auVar28,local_aa0,auVar14);
    auVar15 = vsubps_avx(auVar142,auVar98);
    fVar212 = auVar14._0_4_;
    fVar213 = auVar14._4_4_;
    auVar29._4_4_ = fVar213 * local_980._4_4_;
    auVar29._0_4_ = fVar212 * (float)local_980._0_4_;
    fVar177 = auVar14._8_4_;
    auVar29._8_4_ = fVar177 * local_980._8_4_;
    fVar178 = auVar14._12_4_;
    auVar29._12_4_ = fVar178 * local_980._12_4_;
    fVar179 = auVar14._16_4_;
    auVar29._16_4_ = fVar179 * local_980._16_4_;
    fVar236 = auVar14._20_4_;
    auVar29._20_4_ = fVar236 * local_980._20_4_;
    fVar237 = auVar14._24_4_;
    auVar29._24_4_ = fVar237 * local_980._24_4_;
    auVar29._28_4_ = auVar142._28_4_;
    auVar89 = vfmsub231ps_fma(auVar29,local_6e0,auVar15);
    auVar30._28_4_ = local_960._28_4_;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(auVar89._12_4_ * auVar89._12_4_,
                            CONCAT48(auVar89._8_4_ * auVar89._8_4_,
                                     CONCAT44(auVar89._4_4_ * auVar89._4_4_,
                                              auVar89._0_4_ * auVar89._0_4_))));
    auVar93 = vfmadd231ps_fma(auVar30,ZEXT1632(auVar93),ZEXT1632(auVar93));
    fVar238 = auVar15._0_4_;
    auVar99._0_4_ = fVar238 * (float)local_aa0._0_4_;
    fVar244 = auVar15._4_4_;
    auVar99._4_4_ = fVar244 * local_aa0._4_4_;
    fVar245 = auVar15._8_4_;
    auVar99._8_4_ = fVar245 * local_aa0._8_4_;
    fVar246 = auVar15._12_4_;
    auVar99._12_4_ = fVar246 * local_aa0._12_4_;
    fVar247 = auVar15._16_4_;
    auVar99._16_4_ = fVar247 * local_aa0._16_4_;
    fVar248 = auVar15._20_4_;
    auVar99._20_4_ = fVar248 * local_aa0._20_4_;
    fVar249 = auVar15._24_4_;
    auVar99._24_4_ = fVar249 * local_aa0._24_4_;
    auVar99._28_4_ = 0;
    auVar200 = vfmsub231ps_fma(auVar99,local_980,auVar170);
    auVar143._0_4_ = fVar175 * fVar175;
    auVar143._4_4_ = fVar176 * fVar176;
    auVar143._8_4_ = fVar194 * fVar194;
    auVar143._12_4_ = fVar208 * fVar208;
    auVar143._16_4_ = fVar209 * fVar209;
    auVar143._20_4_ = fVar210 * fVar210;
    auVar143._24_4_ = fVar211 * fVar211;
    auVar143._28_4_ = 0;
    auVar89 = vfmadd231ps_fma(auVar143,auVar15,auVar15);
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar14,auVar14);
    auVar97 = vrcpps_avx(ZEXT1632(auVar89));
    auVar200 = vfmadd231ps_fma(ZEXT1632(auVar93),ZEXT1632(auVar200),ZEXT1632(auVar200));
    auVar252._8_4_ = 0x3f800000;
    auVar252._0_8_ = 0x3f8000003f800000;
    auVar252._12_4_ = 0x3f800000;
    auVar252._16_4_ = 0x3f800000;
    auVar252._20_4_ = 0x3f800000;
    auVar252._24_4_ = 0x3f800000;
    auVar252._28_4_ = 0x3f800000;
    auVar93 = vfnmadd213ps_fma(auVar97,ZEXT1632(auVar89),auVar252);
    auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar97,auVar97);
    local_ac0 = vpermps_avx2(_DAT_01fec480,local_6e0);
    local_8c0 = vpermps_avx2(_DAT_01fec480,local_aa0);
    auVar31._4_4_ = local_ac0._4_4_ * fVar176;
    auVar31._0_4_ = local_ac0._0_4_ * fVar175;
    auVar31._8_4_ = local_ac0._8_4_ * fVar194;
    auVar31._12_4_ = local_ac0._12_4_ * fVar208;
    auVar31._16_4_ = local_ac0._16_4_ * fVar209;
    auVar31._20_4_ = local_ac0._20_4_ * fVar210;
    auVar31._24_4_ = local_ac0._24_4_ * fVar211;
    auVar31._28_4_ = auVar97._28_4_;
    auVar222 = vfmsub231ps_fma(auVar31,local_8c0,auVar14);
    auVar202 = vpermps_avx2(_DAT_01fec480,local_980);
    auVar32._4_4_ = fVar213 * auVar202._4_4_;
    auVar32._0_4_ = fVar212 * auVar202._0_4_;
    auVar32._8_4_ = fVar177 * auVar202._8_4_;
    auVar32._12_4_ = fVar178 * auVar202._12_4_;
    auVar32._16_4_ = fVar179 * auVar202._16_4_;
    auVar32._20_4_ = fVar236 * auVar202._20_4_;
    auVar32._24_4_ = fVar237 * auVar202._24_4_;
    auVar32._28_4_ = 0x40400000;
    auVar3 = vfmsub231ps_fma(auVar32,local_ac0,auVar15);
    auVar222 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar3._12_4_ * auVar3._12_4_,
                                                  CONCAT48(auVar3._8_4_ * auVar3._8_4_,
                                                           CONCAT44(auVar3._4_4_ * auVar3._4_4_,
                                                                    auVar3._0_4_ * auVar3._0_4_)))),
                               ZEXT1632(auVar222),ZEXT1632(auVar222));
    auVar187._0_4_ = fVar238 * local_8c0._0_4_;
    auVar187._4_4_ = fVar244 * local_8c0._4_4_;
    auVar187._8_4_ = fVar245 * local_8c0._8_4_;
    auVar187._12_4_ = fVar246 * local_8c0._12_4_;
    auVar187._16_4_ = fVar247 * local_8c0._16_4_;
    auVar187._20_4_ = fVar248 * local_8c0._20_4_;
    auVar187._24_4_ = fVar249 * local_8c0._24_4_;
    auVar187._28_4_ = 0;
    auVar3 = vfmsub231ps_fma(auVar187,auVar202,auVar170);
    auVar222 = vfmadd231ps_fma(ZEXT1632(auVar222),ZEXT1632(auVar3),ZEXT1632(auVar3));
    auVar97 = vmaxps_avx(ZEXT1632(CONCAT412(auVar200._12_4_ * auVar93._12_4_,
                                            CONCAT48(auVar200._8_4_ * auVar93._8_4_,
                                                     CONCAT44(auVar200._4_4_ * auVar93._4_4_,
                                                              auVar200._0_4_ * auVar93._0_4_)))),
                         ZEXT1632(CONCAT412(auVar222._12_4_ * auVar93._12_4_,
                                            CONCAT48(auVar222._8_4_ * auVar93._8_4_,
                                                     CONCAT44(auVar222._4_4_ * auVar93._4_4_,
                                                              auVar222._0_4_ * auVar93._0_4_)))));
    auVar166._0_4_ = auVar87._0_4_ + fVar111;
    auVar166._4_4_ = auVar87._4_4_ + fVar132;
    auVar166._8_4_ = auVar87._8_4_ + fVar133;
    auVar166._12_4_ = auVar87._12_4_ + fVar134;
    auVar166._16_4_ = fVar135 + 0.0;
    auVar166._20_4_ = fVar136 + 0.0;
    auVar166._24_4_ = fVar137 + 0.0;
    auVar166._28_4_ = auVar261._28_4_ + 0.0;
    auStack_770 = auVar166._16_16_;
    local_760 = ZEXT1632(auVar87);
    auVar261 = vsubps_avx(local_760,auVar27);
    auVar223 = vpermps_avx2(_DAT_01fec480,auVar261);
    auVar224 = vpermps_avx2(_DAT_01fec480,local_760);
    auVar261 = vmaxps_avx(local_760,auVar166);
    auVar145 = vmaxps_avx(auVar223,auVar224);
    auVar13 = vrsqrtps_avx(ZEXT1632(auVar89));
    auVar261 = vmaxps_avx(auVar261,auVar145);
    fVar111 = auVar13._0_4_;
    fVar132 = auVar13._4_4_;
    fVar133 = auVar13._8_4_;
    fVar134 = auVar13._12_4_;
    fVar137 = auVar13._16_4_;
    fVar135 = auVar13._20_4_;
    fVar136 = auVar13._24_4_;
    auVar33._4_4_ = fVar132 * fVar132 * fVar132 * auVar89._4_4_ * -0.5;
    auVar33._0_4_ = fVar111 * fVar111 * fVar111 * auVar89._0_4_ * -0.5;
    auVar33._8_4_ = fVar133 * fVar133 * fVar133 * auVar89._8_4_ * -0.5;
    auVar33._12_4_ = fVar134 * fVar134 * fVar134 * auVar89._12_4_ * -0.5;
    auVar33._16_4_ = fVar137 * fVar137 * fVar137 * -0.0;
    auVar33._20_4_ = fVar135 * fVar135 * fVar135 * -0.0;
    auVar33._24_4_ = fVar136 * fVar136 * fVar136 * -0.0;
    auVar33._28_4_ = 0;
    auVar100._8_4_ = 0x3fc00000;
    auVar100._0_8_ = 0x3fc000003fc00000;
    auVar100._12_4_ = 0x3fc00000;
    auVar100._16_4_ = 0x3fc00000;
    auVar100._20_4_ = 0x3fc00000;
    auVar100._24_4_ = 0x3fc00000;
    auVar100._28_4_ = 0x3fc00000;
    auVar93 = vfmadd231ps_fma(auVar33,auVar100,auVar13);
    fVar132 = auVar93._0_4_;
    fVar133 = auVar93._4_4_;
    auVar34._4_4_ = fVar244 * fVar133;
    auVar34._0_4_ = fVar238 * fVar132;
    fVar137 = auVar93._8_4_;
    auVar34._8_4_ = fVar245 * fVar137;
    fVar136 = auVar93._12_4_;
    auVar34._12_4_ = fVar246 * fVar136;
    auVar34._16_4_ = fVar247 * 0.0;
    auVar34._20_4_ = fVar248 * 0.0;
    auVar34._24_4_ = fVar249 * 0.0;
    auVar34._28_4_ = 0x3fc00000;
    auVar256._0_4_ = local_520 * fVar175 * fVar132;
    auVar256._4_4_ = fStack_51c * fVar176 * fVar133;
    auVar256._8_4_ = fStack_518 * fVar194 * fVar137;
    auVar256._12_4_ = fStack_514 * fVar208 * fVar136;
    auVar256._16_4_ = fStack_510 * fVar209 * 0.0;
    auVar256._20_4_ = fStack_50c * fVar210 * 0.0;
    auVar256._24_4_ = fStack_508 * fVar211 * 0.0;
    auVar256._28_4_ = 0;
    auVar89 = vfmadd231ps_fma(auVar256,auVar34,_local_680);
    auVar232 = ZEXT1632(auVar220);
    local_700 = vsubps_avx(ZEXT832(0) << 0x20,auVar232);
    fVar238 = local_700._0_4_;
    fVar244 = local_700._4_4_;
    auVar35._4_4_ = fVar244 * fVar176 * fVar133;
    auVar35._0_4_ = fVar238 * fVar175 * fVar132;
    fVar175 = local_700._8_4_;
    auVar35._8_4_ = fVar175 * fVar194 * fVar137;
    fVar176 = local_700._12_4_;
    auVar35._12_4_ = fVar176 * fVar208 * fVar136;
    fVar245 = local_700._16_4_;
    auVar35._16_4_ = fVar245 * fVar209 * 0.0;
    fVar246 = local_700._20_4_;
    auVar35._20_4_ = fVar246 * fVar210 * 0.0;
    fVar247 = local_700._24_4_;
    auVar35._24_4_ = fVar247 * fVar211 * 0.0;
    auVar35._28_4_ = auVar170._28_4_;
    auVar13 = vsubps_avx(ZEXT832(0) << 0x20,auVar98);
    auVar200 = vfmadd231ps_fma(auVar35,auVar13,auVar34);
    auVar36._4_4_ = fVar213 * fVar133;
    auVar36._0_4_ = fVar212 * fVar132;
    auVar36._8_4_ = fVar177 * fVar137;
    auVar36._12_4_ = fVar178 * fVar136;
    auVar36._16_4_ = fVar179 * 0.0;
    auVar36._20_4_ = fVar236 * 0.0;
    auVar36._24_4_ = fVar237 * 0.0;
    auVar36._28_4_ = 0x3fc00000;
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar36,_local_500);
    auVar144 = vsubps_avx(ZEXT832(0) << 0x20,local_ae0);
    auVar242 = ZEXT3264(auVar144);
    auVar200 = vfmadd231ps_fma(ZEXT1632(auVar200),auVar144,auVar36);
    auVar227 = ZEXT1664(auVar200);
    auVar37._4_4_ = fStack_51c * fVar244;
    auVar37._0_4_ = local_520 * fVar238;
    auVar37._8_4_ = fStack_518 * fVar175;
    auVar37._12_4_ = fStack_514 * fVar176;
    auVar37._16_4_ = fStack_510 * fVar245;
    auVar37._20_4_ = fStack_50c * fVar246;
    auVar37._24_4_ = fStack_508 * fVar247;
    auVar37._28_4_ = 0x3fc00000;
    auVar222 = vfmadd231ps_fma(auVar37,_local_680,auVar13);
    auVar222 = vfmadd231ps_fma(ZEXT1632(auVar222),_local_500,auVar144);
    fVar111 = auVar200._0_4_;
    fVar211 = auVar89._0_4_;
    fVar134 = auVar200._4_4_;
    fVar212 = auVar89._4_4_;
    fVar135 = auVar200._8_4_;
    fVar213 = auVar89._8_4_;
    fVar194 = auVar200._12_4_;
    fVar177 = auVar89._12_4_;
    auVar16 = vsubps_avx(ZEXT1632(auVar222),
                         ZEXT1632(CONCAT412(fVar177 * fVar194,
                                            CONCAT48(fVar213 * fVar135,
                                                     CONCAT44(fVar212 * fVar134,fVar211 * fVar111)))
                                 ));
    auVar38._4_4_ = fVar244 * fVar244;
    auVar38._0_4_ = fVar238 * fVar238;
    auVar38._8_4_ = fVar175 * fVar175;
    auVar38._12_4_ = fVar176 * fVar176;
    auVar38._16_4_ = fVar245 * fVar245;
    auVar38._20_4_ = fVar246 * fVar246;
    auVar38._24_4_ = fVar247 * fVar247;
    auVar38._28_4_ = 0;
    auVar222 = vfmadd231ps_fma(auVar38,auVar13,auVar13);
    auVar222 = vfmadd231ps_fma(ZEXT1632(auVar222),auVar144,auVar144);
    auVar39._28_4_ = local_500._28_4_;
    auVar39._0_28_ =
         ZEXT1628(CONCAT412(fVar194 * fVar194,
                            CONCAT48(fVar135 * fVar135,CONCAT44(fVar134 * fVar134,fVar111 * fVar111)
                                    )));
    auVar11 = vsubps_avx(ZEXT1632(auVar222),auVar39);
    auVar145 = vsqrtps_avx(auVar97);
    fVar111 = (auVar145._0_4_ + auVar261._0_4_) * 1.0000002;
    fVar134 = (auVar145._4_4_ + auVar261._4_4_) * 1.0000002;
    fVar135 = (auVar145._8_4_ + auVar261._8_4_) * 1.0000002;
    fVar194 = (auVar145._12_4_ + auVar261._12_4_) * 1.0000002;
    fVar208 = (auVar145._16_4_ + auVar261._16_4_) * 1.0000002;
    fVar209 = (auVar145._20_4_ + auVar261._20_4_) * 1.0000002;
    fVar210 = (auVar145._24_4_ + auVar261._24_4_) * 1.0000002;
    auVar40._4_4_ = fVar134 * fVar134;
    auVar40._0_4_ = fVar111 * fVar111;
    auVar40._8_4_ = fVar135 * fVar135;
    auVar40._12_4_ = fVar194 * fVar194;
    auVar40._16_4_ = fVar208 * fVar208;
    auVar40._20_4_ = fVar209 * fVar209;
    auVar40._24_4_ = fVar210 * fVar210;
    auVar40._28_4_ = auVar145._28_4_ + auVar261._28_4_;
    local_600._0_4_ = auVar16._0_4_ + auVar16._0_4_;
    local_600._4_4_ = auVar16._4_4_ + auVar16._4_4_;
    fStack_5f8 = auVar16._8_4_ + auVar16._8_4_;
    fStack_5f4 = auVar16._12_4_ + auVar16._12_4_;
    fStack_5f0 = auVar16._16_4_ + auVar16._16_4_;
    fStack_5ec = auVar16._20_4_ + auVar16._20_4_;
    fStack_5e8 = auVar16._24_4_ + auVar16._24_4_;
    fStack_5e4 = auVar16._28_4_ + auVar16._28_4_;
    auVar261 = vsubps_avx(auVar11,auVar40);
    local_9c0._28_4_ = fStack_504;
    local_9c0._0_28_ =
         ZEXT1628(CONCAT412(fVar177 * fVar177,
                            CONCAT48(fVar213 * fVar213,CONCAT44(fVar212 * fVar212,fVar211 * fVar211)
                                    )));
    auVar16 = vsubps_avx(local_2a0,local_9c0);
    auVar41._4_4_ = (float)local_600._4_4_ * (float)local_600._4_4_;
    auVar41._0_4_ = (float)local_600._0_4_ * (float)local_600._0_4_;
    auVar41._8_4_ = fStack_5f8 * fStack_5f8;
    auVar41._12_4_ = fStack_5f4 * fStack_5f4;
    auVar41._16_4_ = fStack_5f0 * fStack_5f0;
    auVar41._20_4_ = fStack_5ec * fStack_5ec;
    auVar41._24_4_ = fStack_5e8 * fStack_5e8;
    auVar41._28_4_ = 0x3f800002;
    fVar134 = auVar16._0_4_;
    fVar135 = auVar16._4_4_;
    fVar194 = auVar16._8_4_;
    fVar208 = auVar16._12_4_;
    fVar209 = auVar16._16_4_;
    fVar210 = auVar16._20_4_;
    fVar211 = auVar16._24_4_;
    auVar42._4_4_ = fVar135 * 4.0 * auVar261._4_4_;
    auVar42._0_4_ = fVar134 * 4.0 * auVar261._0_4_;
    auVar42._8_4_ = fVar194 * 4.0 * auVar261._8_4_;
    auVar42._12_4_ = fVar208 * 4.0 * auVar261._12_4_;
    auVar42._16_4_ = fVar209 * 4.0 * auVar261._16_4_;
    auVar42._20_4_ = fVar210 * 4.0 * auVar261._20_4_;
    auVar42._24_4_ = fVar211 * 4.0 * auVar261._24_4_;
    auVar42._28_4_ = 0x40800000;
    auVar12 = vsubps_avx(auVar41,auVar42);
    auVar97 = vcmpps_avx(auVar12,ZEXT432(0) << 0x20,5);
    local_9a0 = ZEXT1632(auVar200);
    fVar111 = auVar16._28_4_;
    if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar97 >> 0x7f,0) == '\0') &&
          (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar97 >> 0xbf,0) == '\0') &&
        (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar97[0x1f]) {
      auVar262._8_4_ = 0x7f800000;
      auVar262._0_8_ = 0x7f8000007f800000;
      auVar262._12_4_ = 0x7f800000;
      auVar262._16_4_ = 0x7f800000;
      auVar262._20_4_ = 0x7f800000;
      auVar262._24_4_ = 0x7f800000;
      auVar262._28_4_ = 0x7f800000;
      auVar188._8_4_ = 0xff800000;
      auVar188._0_8_ = 0xff800000ff800000;
      auVar188._12_4_ = 0xff800000;
      auVar188._16_4_ = 0xff800000;
      auVar188._20_4_ = 0xff800000;
      auVar188._24_4_ = 0xff800000;
      auVar188._28_4_ = 0xff800000;
      auVar12 = local_2a0;
    }
    else {
      auVar259 = vsqrtps_avx(auVar12);
      auVar263._0_4_ = fVar134 + fVar134;
      auVar263._4_4_ = fVar135 + fVar135;
      auVar263._8_4_ = fVar194 + fVar194;
      auVar263._12_4_ = fVar208 + fVar208;
      auVar263._16_4_ = fVar209 + fVar209;
      auVar263._20_4_ = fVar210 + fVar210;
      auVar263._24_4_ = fVar211 + fVar211;
      auVar263._28_4_ = fVar111 + fVar111;
      auVar168 = vrcpps_avx(auVar263);
      auVar169 = vcmpps_avx(auVar12,ZEXT432(0) << 0x20,5);
      auVar189._8_4_ = 0x3f800000;
      auVar189._0_8_ = 0x3f8000003f800000;
      auVar189._12_4_ = 0x3f800000;
      auVar189._16_4_ = 0x3f800000;
      auVar189._20_4_ = 0x3f800000;
      auVar189._24_4_ = 0x3f800000;
      auVar189._28_4_ = 0x3f800000;
      auVar200 = vfnmadd213ps_fma(auVar263,auVar168,auVar189);
      auVar200 = vfmadd132ps_fma(ZEXT1632(auVar200),auVar168,auVar168);
      auVar190._0_4_ = local_600._0_4_ ^ local_660;
      auVar190._4_4_ = local_600._4_4_ ^ uStack_65c;
      auVar190._8_4_ = (uint)fStack_5f8 ^ uStack_658;
      auVar190._12_4_ = (uint)fStack_5f4 ^ uStack_654;
      auVar190._16_4_ = (uint)fStack_5f0 ^ (uint)fStack_650;
      auVar190._20_4_ = (uint)fStack_5ec ^ (uint)fStack_64c;
      auVar190._24_4_ = (uint)fStack_5e8 ^ (uint)fStack_648;
      auVar190._28_4_ = (uint)fStack_5e4 ^ uStack_644;
      auVar260 = vsubps_avx(auVar190,auVar259);
      auVar43._4_4_ = auVar200._4_4_ * auVar260._4_4_;
      auVar43._0_4_ = auVar200._0_4_ * auVar260._0_4_;
      auVar43._8_4_ = auVar200._8_4_ * auVar260._8_4_;
      auVar43._12_4_ = auVar200._12_4_ * auVar260._12_4_;
      auVar43._16_4_ = auVar260._16_4_ * 0.0;
      auVar43._20_4_ = auVar260._20_4_ * 0.0;
      auVar43._24_4_ = auVar260._24_4_ * 0.0;
      auVar43._28_4_ = auVar260._28_4_;
      auVar12 = vsubps_avx(auVar259,_local_600);
      auVar44._4_4_ = auVar200._4_4_ * auVar12._4_4_;
      auVar44._0_4_ = auVar200._0_4_ * auVar12._0_4_;
      auVar44._8_4_ = auVar200._8_4_ * auVar12._8_4_;
      auVar44._12_4_ = auVar200._12_4_ * auVar12._12_4_;
      auVar44._16_4_ = auVar12._16_4_ * 0.0;
      auVar44._20_4_ = auVar12._20_4_ * 0.0;
      auVar44._24_4_ = auVar12._24_4_ * 0.0;
      auVar44._28_4_ = auVar168._28_4_;
      auVar200 = vfmadd213ps_fma(ZEXT1632(auVar89),auVar43,local_9a0);
      local_360 = ZEXT1632(CONCAT412(fVar136 * auVar200._12_4_,
                                     CONCAT48(fVar137 * auVar200._8_4_,
                                              CONCAT44(fVar133 * auVar200._4_4_,
                                                       fVar132 * auVar200._0_4_))));
      auVar12 = vandps_avx(local_9c0,local_7c0);
      auVar12 = vmaxps_avx(local_420,auVar12);
      auVar45._4_4_ = auVar12._4_4_ * 1.9073486e-06;
      auVar45._0_4_ = auVar12._0_4_ * 1.9073486e-06;
      auVar45._8_4_ = auVar12._8_4_ * 1.9073486e-06;
      auVar45._12_4_ = auVar12._12_4_ * 1.9073486e-06;
      auVar45._16_4_ = auVar12._16_4_ * 1.9073486e-06;
      auVar45._20_4_ = auVar12._20_4_ * 1.9073486e-06;
      auVar45._24_4_ = auVar12._24_4_ * 1.9073486e-06;
      auVar45._28_4_ = auVar12._28_4_;
      auVar12 = vandps_avx(auVar16,local_7c0);
      auVar168 = vcmpps_avx(auVar12,auVar45,1);
      auVar200 = vfmadd213ps_fma(ZEXT1632(auVar89),auVar44,local_9a0);
      auVar229._8_4_ = 0x7f800000;
      auVar229._0_8_ = 0x7f8000007f800000;
      auVar229._12_4_ = 0x7f800000;
      auVar229._16_4_ = 0x7f800000;
      auVar229._20_4_ = 0x7f800000;
      auVar229._24_4_ = 0x7f800000;
      auVar229._28_4_ = 0x7f800000;
      auVar262 = vblendvps_avx(auVar229,auVar43,auVar169);
      local_380 = auVar200._0_4_ * fVar132;
      fStack_37c = auVar200._4_4_ * fVar133;
      fStack_378 = auVar200._8_4_ * fVar137;
      fStack_374 = auVar200._12_4_ * fVar136;
      uStack_370 = 0;
      uStack_36c = 0;
      uStack_368 = 0;
      uStack_364 = auVar260._28_4_;
      auVar191._8_4_ = 0xff800000;
      auVar191._0_8_ = 0xff800000ff800000;
      auVar191._12_4_ = 0xff800000;
      auVar191._16_4_ = 0xff800000;
      auVar191._20_4_ = 0xff800000;
      auVar191._24_4_ = 0xff800000;
      auVar191._28_4_ = 0xff800000;
      auVar188 = vblendvps_avx(auVar191,auVar44,auVar169);
      auVar259 = auVar169 & auVar168;
      auVar12 = local_7c0;
      if ((((((((auVar259 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar259 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar259 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar259 >> 0x7f,0) != '\0') ||
            (auVar259 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar259 >> 0xbf,0) != '\0') ||
          (auVar259 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar259[0x1f] < '\0') {
        auVar97 = vandps_avx(auVar168,auVar169);
        auVar168 = vcmpps_avx(auVar261,ZEXT832(0) << 0x20,2);
        auVar227 = ZEXT3264(auVar168);
        auVar230._8_4_ = 0xff800000;
        auVar230._0_8_ = 0xff800000ff800000;
        auVar230._12_4_ = 0xff800000;
        auVar230._16_4_ = 0xff800000;
        auVar230._20_4_ = 0xff800000;
        auVar230._24_4_ = 0xff800000;
        auVar230._28_4_ = 0xff800000;
        auVar254._8_4_ = 0x7f800000;
        auVar254._0_8_ = 0x7f8000007f800000;
        auVar254._12_4_ = 0x7f800000;
        auVar254._16_4_ = 0x7f800000;
        auVar254._20_4_ = 0x7f800000;
        auVar254._24_4_ = 0x7f800000;
        auVar254._28_4_ = 0x7f800000;
        auVar261 = vblendvps_avx(auVar254,auVar230,auVar168);
        auVar200 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
        auVar259 = vpmovsxwd_avx2(auVar200);
        auVar262 = vblendvps_avx(auVar262,auVar261,auVar259);
        auVar12 = vblendvps_avx(auVar230,auVar254,auVar168);
        auVar188 = vblendvps_avx(auVar188,auVar12,auVar259);
        auVar108._0_8_ = auVar97._0_8_ ^ 0xffffffffffffffff;
        auVar108._8_4_ = auVar97._8_4_ ^ 0xffffffff;
        auVar108._12_4_ = auVar97._12_4_ ^ 0xffffffff;
        auVar108._16_4_ = auVar97._16_4_ ^ 0xffffffff;
        auVar108._20_4_ = auVar97._20_4_ ^ 0xffffffff;
        auVar108._24_4_ = auVar97._24_4_ ^ 0xffffffff;
        auVar108._28_4_ = auVar97._28_4_ ^ 0xffffffff;
        auVar97 = vorps_avx(auVar168,auVar108);
        auVar97 = vandps_avx(auVar169,auVar97);
      }
    }
    local_3a0 = ZEXT1632(auVar89);
    auVar234 = ZEXT3264(auVar12);
    auVar261 = local_6a0 & auVar97;
    if ((((((((auVar261 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar261 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar261 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar261 >> 0x7f,0) == '\0') &&
          (auVar261 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar261 >> 0xbf,0) == '\0') &&
        (auVar261 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar261[0x1f])
    {
      auVar258 = ZEXT3264(local_a80);
      auVar250 = ZEXT3264(local_920);
    }
    else {
      fVar212 = (ray->org).field_0.m128[3] - (float)local_840._0_4_;
      auVar101._4_4_ = fVar212;
      auVar101._0_4_ = fVar212;
      auVar101._8_4_ = fVar212;
      auVar101._12_4_ = fVar212;
      auVar101._16_4_ = fVar212;
      auVar101._20_4_ = fVar212;
      auVar101._24_4_ = fVar212;
      auVar101._28_4_ = fVar212;
      auVar12 = vmaxps_avx(auVar101,auVar262);
      fVar212 = ray->tfar - (float)local_840._0_4_;
      auVar203._4_4_ = fVar212;
      auVar203._0_4_ = fVar212;
      auVar203._8_4_ = fVar212;
      auVar203._12_4_ = fVar212;
      auVar203._16_4_ = fVar212;
      auVar203._20_4_ = fVar212;
      auVar203._24_4_ = fVar212;
      auVar203._28_4_ = fVar212;
      auVar169 = vminps_avx(auVar203,auVar188);
      auVar258._0_4_ = (float)local_aa0._0_4_ * fVar238;
      auVar258._4_4_ = local_aa0._4_4_ * fVar244;
      auVar258._8_4_ = local_aa0._8_4_ * fVar175;
      auVar258._12_4_ = local_aa0._12_4_ * fVar176;
      auVar258._16_4_ = local_aa0._16_4_ * fVar245;
      auVar258._20_4_ = local_aa0._20_4_ * fVar246;
      auVar258._28_36_ = SUB4836((undefined1  [48])0x0,0xc);
      auVar258._24_4_ = local_aa0._24_4_ * fVar247;
      auVar89 = vfmadd213ps_fma(auVar13,local_980,auVar258._0_32_);
      auVar200 = vfmadd213ps_fma(auVar144,local_6e0,ZEXT1632(auVar89));
      auVar227 = ZEXT3264(CONCAT428(fStack_504,
                                    CONCAT424(fStack_508,
                                              CONCAT420(fStack_50c,
                                                        CONCAT416(fStack_510,
                                                                  CONCAT412(fStack_514,
                                                                            CONCAT48(fStack_518,
                                                                                     CONCAT44(
                                                  fStack_51c,local_520))))))));
      auVar167._0_4_ = local_520 * (float)local_aa0._0_4_;
      auVar167._4_4_ = fStack_51c * local_aa0._4_4_;
      auVar167._8_4_ = fStack_518 * local_aa0._8_4_;
      auVar167._12_4_ = fStack_514 * local_aa0._12_4_;
      auVar167._16_4_ = fStack_510 * local_aa0._16_4_;
      auVar167._20_4_ = fStack_50c * local_aa0._20_4_;
      auVar167._24_4_ = fStack_508 * local_aa0._24_4_;
      auVar167._28_4_ = 0;
      auVar89 = vfmadd231ps_fma(auVar167,_local_680,local_980);
      auVar222 = vfmadd231ps_fma(ZEXT1632(auVar89),_local_500,local_6e0);
      auVar261 = vandps_avx(local_7c0,ZEXT1632(auVar222));
      auVar253._8_4_ = 0x219392ef;
      auVar253._0_8_ = 0x219392ef219392ef;
      auVar253._12_4_ = 0x219392ef;
      auVar253._16_4_ = 0x219392ef;
      auVar253._20_4_ = 0x219392ef;
      auVar253._24_4_ = 0x219392ef;
      auVar253._28_4_ = 0x219392ef;
      auVar13 = vcmpps_avx(auVar261,auVar253,1);
      auVar261 = vrcpps_avx(ZEXT1632(auVar222));
      auVar257._8_4_ = 0x3f800000;
      auVar257._0_8_ = 0x3f8000003f800000;
      auVar257._12_4_ = 0x3f800000;
      auVar257._16_4_ = 0x3f800000;
      auVar257._20_4_ = 0x3f800000;
      auVar257._24_4_ = 0x3f800000;
      auVar257._28_4_ = 0x3f800000;
      auVar168 = ZEXT1632(auVar222);
      auVar89 = vfnmadd213ps_fma(auVar261,auVar168,auVar257);
      auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar261,auVar261);
      auVar240._0_4_ = local_660 ^ auVar222._0_4_;
      auVar240._4_4_ = uStack_65c ^ auVar222._4_4_;
      auVar240._8_4_ = uStack_658 ^ auVar222._8_4_;
      auVar240._12_4_ = uStack_654 ^ auVar222._12_4_;
      auVar240._16_4_ = fStack_650;
      auVar240._20_4_ = fStack_64c;
      auVar240._24_4_ = fStack_648;
      auVar240._28_4_ = uStack_644;
      auVar46._4_4_ = auVar89._4_4_ * (float)(auVar200._4_4_ ^ uStack_65c);
      auVar46._0_4_ = auVar89._0_4_ * (float)(auVar200._0_4_ ^ local_660);
      auVar46._8_4_ = auVar89._8_4_ * (float)(auVar200._8_4_ ^ uStack_658);
      auVar46._12_4_ = auVar89._12_4_ * (float)(auVar200._12_4_ ^ uStack_654);
      auVar46._16_4_ = fStack_650 * 0.0;
      auVar46._20_4_ = fStack_64c * 0.0;
      auVar46._24_4_ = fStack_648 * 0.0;
      auVar46._28_4_ = uStack_644;
      auVar261 = vcmpps_avx(auVar168,auVar240,1);
      auVar261 = vorps_avx(auVar13,auVar261);
      auVar264._8_4_ = 0xff800000;
      auVar264._0_8_ = 0xff800000ff800000;
      auVar264._12_4_ = 0xff800000;
      auVar264._16_4_ = 0xff800000;
      auVar264._20_4_ = 0xff800000;
      auVar264._24_4_ = 0xff800000;
      auVar264._28_4_ = 0xff800000;
      auVar261 = vblendvps_avx(auVar46,auVar264,auVar261);
      auVar144 = vmaxps_avx(auVar12,auVar261);
      auVar261 = vcmpps_avx(auVar168,auVar240,6);
      auVar261 = vorps_avx(auVar13,auVar261);
      auVar241._8_4_ = 0x7f800000;
      auVar241._0_8_ = 0x7f8000007f800000;
      auVar241._12_4_ = 0x7f800000;
      auVar241._16_4_ = 0x7f800000;
      auVar241._20_4_ = 0x7f800000;
      auVar241._24_4_ = 0x7f800000;
      auVar241._28_4_ = 0x7f800000;
      auVar242 = ZEXT3264(auVar241);
      auVar261 = vblendvps_avx(auVar46,auVar241,auVar261);
      auVar12 = vminps_avx(auVar169,auVar261);
      fVar212 = (float)(local_660 ^ (uint)local_8c0._0_4_);
      fVar213 = (float)(uStack_65c ^ (uint)local_8c0._4_4_);
      fVar175 = (float)(uStack_658 ^ (uint)local_8c0._8_4_);
      fVar176 = (float)(uStack_654 ^ (uint)local_8c0._12_4_);
      fVar177 = (float)((uint)fStack_650 ^ (uint)local_8c0._16_4_);
      fVar178 = (float)((uint)fStack_64c ^ (uint)local_8c0._20_4_);
      fVar179 = (float)((uint)fStack_648 ^ (uint)local_8c0._24_4_);
      auStack_850._12_4_ = auVar202._28_4_;
      auVar192._0_4_ = local_660 ^ (uint)auVar202._0_4_;
      auVar192._4_4_ = uStack_65c ^ (uint)auVar202._4_4_;
      auVar192._8_4_ = uStack_658 ^ (uint)auVar202._8_4_;
      auVar192._12_4_ = uStack_654 ^ (uint)auVar202._12_4_;
      auVar192._16_4_ = (uint)fStack_650 ^ (uint)auVar202._16_4_;
      auVar192._20_4_ = (uint)fStack_64c ^ (uint)auVar202._20_4_;
      auVar192._24_4_ = (uint)fStack_648 ^ (uint)auVar202._24_4_;
      auVar192._28_4_ = uStack_644 ^ auStack_850._12_4_;
      auVar261 = vsubps_avx(ZEXT832(0) << 0x20,auVar142);
      auVar13 = vsubps_avx(ZEXT832(0) << 0x20,local_960);
      auVar47._4_4_ = auVar13._4_4_ * fVar213;
      auVar47._0_4_ = auVar13._0_4_ * fVar212;
      auVar47._8_4_ = auVar13._8_4_ * fVar175;
      auVar47._12_4_ = auVar13._12_4_ * fVar176;
      auVar47._16_4_ = auVar13._16_4_ * fVar177;
      auVar47._20_4_ = auVar13._20_4_ * fVar178;
      auVar47._24_4_ = auVar13._24_4_ * fVar179;
      auVar47._28_4_ = auVar13._28_4_;
      auVar89 = vfmadd231ps_fma(auVar47,auVar192,auVar261);
      auVar204._0_4_ = local_660 ^ (uint)local_ac0._0_4_;
      auVar204._4_4_ = uStack_65c ^ (uint)local_ac0._4_4_;
      auVar204._8_4_ = uStack_658 ^ (uint)local_ac0._8_4_;
      auVar204._12_4_ = uStack_654 ^ (uint)local_ac0._12_4_;
      auVar204._16_4_ = (uint)fStack_650 ^ (uint)local_ac0._16_4_;
      auVar204._20_4_ = (uint)fStack_64c ^ (uint)local_ac0._20_4_;
      auVar204._24_4_ = (uint)fStack_648 ^ (uint)local_ac0._24_4_;
      auVar204._28_4_ = uStack_644 ^ local_ac0._28_4_;
      auVar261 = vsubps_avx(ZEXT832(0) << 0x20,auVar124);
      auVar200 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar204,auVar261);
      auVar48._4_4_ = fStack_51c * fVar213;
      auVar48._0_4_ = local_520 * fVar212;
      auVar48._8_4_ = fStack_518 * fVar175;
      auVar48._12_4_ = fStack_514 * fVar176;
      auVar48._16_4_ = fStack_510 * fVar177;
      auVar48._20_4_ = fStack_50c * fVar178;
      auVar48._24_4_ = fStack_508 * fVar179;
      auVar48._28_4_ = uStack_644 ^ local_8c0._28_4_;
      auVar89 = vfmadd231ps_fma(auVar48,_local_680,auVar192);
      auVar222 = vfmadd231ps_fma(ZEXT1632(auVar89),_local_500,auVar204);
      auVar261 = vandps_avx(local_7c0,ZEXT1632(auVar222));
      auVar124 = vrcpps_avx(ZEXT1632(auVar222));
      auVar233._8_4_ = 0x219392ef;
      auVar233._0_8_ = 0x219392ef219392ef;
      auVar233._12_4_ = 0x219392ef;
      auVar233._16_4_ = 0x219392ef;
      auVar233._20_4_ = 0x219392ef;
      auVar233._24_4_ = 0x219392ef;
      auVar233._28_4_ = 0x219392ef;
      auVar13 = vcmpps_avx(auVar261,auVar233,1);
      auVar169 = ZEXT1632(auVar222);
      auVar89 = vfnmadd213ps_fma(auVar124,auVar169,auVar257);
      auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar124,auVar124);
      auVar205._0_4_ = local_660 ^ auVar222._0_4_;
      auVar205._4_4_ = uStack_65c ^ auVar222._4_4_;
      auVar205._8_4_ = uStack_658 ^ auVar222._8_4_;
      auVar205._12_4_ = uStack_654 ^ auVar222._12_4_;
      auVar205._16_4_ = fStack_650;
      auVar205._20_4_ = fStack_64c;
      auVar205._24_4_ = fStack_648;
      auVar205._28_4_ = uStack_644;
      auVar49._4_4_ = auVar89._4_4_ * (float)(uStack_65c ^ auVar200._4_4_);
      auVar49._0_4_ = auVar89._0_4_ * (float)(local_660 ^ auVar200._0_4_);
      auVar49._8_4_ = auVar89._8_4_ * (float)(uStack_658 ^ auVar200._8_4_);
      auVar49._12_4_ = auVar89._12_4_ * (float)(uStack_654 ^ auVar200._12_4_);
      auVar49._16_4_ = fStack_650 * 0.0;
      auVar49._20_4_ = fStack_64c * 0.0;
      auVar49._24_4_ = fStack_648 * 0.0;
      auVar49._28_4_ = uStack_644;
      auVar261 = vcmpps_avx(auVar169,auVar205,1);
      auVar261 = vorps_avx(auVar261,auVar13);
      auVar261 = vblendvps_avx(auVar49,auVar264,auVar261);
      auVar234 = ZEXT3264(auVar261);
      _local_640 = vmaxps_avx(auVar144,auVar261);
      auVar261 = vcmpps_avx(auVar169,auVar205,6);
      auVar261 = vorps_avx(auVar13,auVar261);
      auVar261 = vblendvps_avx(auVar49,auVar241,auVar261);
      auVar97 = vandps_avx(local_6a0,auVar97);
      local_480 = vminps_avx(auVar12,auVar261);
      auVar261 = vcmpps_avx(_local_640,local_480,2);
      auVar13 = auVar97 & auVar261;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar13 >> 0x7f,0) == '\0') &&
            (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar13 >> 0xbf,0) == '\0') &&
          (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar13[0x1f])
      {
        auVar258 = ZEXT3264(local_a80);
        auVar250 = ZEXT3264(local_920);
      }
      else {
        auVar206._8_4_ = 0x3f800000;
        auVar206._0_8_ = 0x3f8000003f800000;
        auVar206._12_4_ = 0x3f800000;
        auVar206._16_4_ = 0x3f800000;
        auVar206._20_4_ = 0x3f800000;
        auVar206._24_4_ = 0x3f800000;
        auVar206._28_4_ = 0x3f800000;
        auVar13 = vminps_avx(local_360,auVar206);
        auVar13 = vmaxps_avx(auVar13,ZEXT832(0) << 0x20);
        auVar68._4_4_ = fStack_37c;
        auVar68._0_4_ = local_380;
        auVar68._8_4_ = fStack_378;
        auVar68._12_4_ = fStack_374;
        auVar68._16_4_ = uStack_370;
        auVar68._20_4_ = uStack_36c;
        auVar68._24_4_ = uStack_368;
        auVar68._28_4_ = uStack_364;
        auVar144 = vminps_avx(auVar68,auVar206);
        auVar144 = vmaxps_avx(auVar144,ZEXT832(0) << 0x20);
        auVar50._4_4_ = (auVar13._4_4_ + 1.0) * 0.125;
        auVar50._0_4_ = (auVar13._0_4_ + 0.0) * 0.125;
        auVar50._8_4_ = (auVar13._8_4_ + 2.0) * 0.125;
        auVar50._12_4_ = (auVar13._12_4_ + 3.0) * 0.125;
        auVar50._16_4_ = (auVar13._16_4_ + 4.0) * 0.125;
        auVar50._20_4_ = (auVar13._20_4_ + 5.0) * 0.125;
        auVar50._24_4_ = (auVar13._24_4_ + 6.0) * 0.125;
        auVar50._28_4_ = auVar13._28_4_ + 7.0;
        auVar89 = vfmadd213ps_fma(auVar50,local_740,local_720);
        auVar51._4_4_ = (auVar144._4_4_ + 1.0) * 0.125;
        auVar51._0_4_ = (auVar144._0_4_ + 0.0) * 0.125;
        auVar51._8_4_ = (auVar144._8_4_ + 2.0) * 0.125;
        auVar51._12_4_ = (auVar144._12_4_ + 3.0) * 0.125;
        auVar51._16_4_ = (auVar144._16_4_ + 4.0) * 0.125;
        auVar51._20_4_ = (auVar144._20_4_ + 5.0) * 0.125;
        auVar51._24_4_ = (auVar144._24_4_ + 6.0) * 0.125;
        auVar51._28_4_ = auVar144._28_4_ + 7.0;
        auVar200 = vfmadd213ps_fma(auVar51,local_740,local_720);
        auVar13 = vminps_avx(local_760,auVar166);
        auVar144 = vminps_avx(auVar223,auVar224);
        auVar13 = vminps_avx(auVar13,auVar144);
        auVar145 = vsubps_avx(auVar13,auVar145);
        local_940 = vandps_avx(auVar261,auVar97);
        local_1a0 = ZEXT1632(auVar89);
        local_1c0 = ZEXT1632(auVar200);
        auVar52._4_4_ = auVar145._4_4_ * 0.99999976;
        auVar52._0_4_ = auVar145._0_4_ * 0.99999976;
        auVar52._8_4_ = auVar145._8_4_ * 0.99999976;
        auVar52._12_4_ = auVar145._12_4_ * 0.99999976;
        auVar52._16_4_ = auVar145._16_4_ * 0.99999976;
        auVar52._20_4_ = auVar145._20_4_ * 0.99999976;
        auVar52._24_4_ = auVar145._24_4_ * 0.99999976;
        auVar52._28_4_ = 0x3f7ffffc;
        auVar97 = vmaxps_avx(ZEXT832(0) << 0x20,auVar52);
        auVar53._4_4_ = auVar97._4_4_ * auVar97._4_4_;
        auVar53._0_4_ = auVar97._0_4_ * auVar97._0_4_;
        auVar53._8_4_ = auVar97._8_4_ * auVar97._8_4_;
        auVar53._12_4_ = auVar97._12_4_ * auVar97._12_4_;
        auVar53._16_4_ = auVar97._16_4_ * auVar97._16_4_;
        auVar53._20_4_ = auVar97._20_4_ * auVar97._20_4_;
        auVar53._24_4_ = auVar97._24_4_ * auVar97._24_4_;
        auVar53._28_4_ = auVar97._28_4_;
        auVar261 = vsubps_avx(auVar11,auVar53);
        auVar234 = ZEXT3264(auVar261);
        auVar54._4_4_ = auVar261._4_4_ * fVar135 * 4.0;
        auVar54._0_4_ = auVar261._0_4_ * fVar134 * 4.0;
        auVar54._8_4_ = auVar261._8_4_ * fVar194 * 4.0;
        auVar54._12_4_ = auVar261._12_4_ * fVar208 * 4.0;
        auVar54._16_4_ = auVar261._16_4_ * fVar209 * 4.0;
        auVar54._20_4_ = auVar261._20_4_ * fVar210 * 4.0;
        auVar54._24_4_ = auVar261._24_4_ * fVar211 * 4.0;
        auVar54._28_4_ = auVar97._28_4_;
        auVar13 = vsubps_avx(auVar41,auVar54);
        auVar64 = ZEXT412(0);
        auVar144 = ZEXT1232(auVar64) << 0x20;
        local_800 = ZEXT1232(auVar64) << 0x20;
        _local_8a0 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,5);
        auVar250 = ZEXT3264(local_920);
        auVar97 = _local_8a0;
        if ((((((((_local_8a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (_local_8a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (_local_8a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(_local_8a0 >> 0x7f,0) == '\0') &&
              (_local_8a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(_local_8a0 >> 0xbf,0) == '\0') &&
            (_local_8a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_8a0[0x1f]) {
          _local_820 = ZEXT1232(auVar64) << 0x20;
          auVar170 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar186 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar207._8_4_ = 0x7f800000;
          auVar207._0_8_ = 0x7f8000007f800000;
          auVar207._12_4_ = 0x7f800000;
          auVar207._16_4_ = 0x7f800000;
          auVar207._20_4_ = 0x7f800000;
          auVar207._24_4_ = 0x7f800000;
          auVar207._28_4_ = 0x7f800000;
          auVar216._8_4_ = 0xff800000;
          auVar216._0_8_ = 0xff800000ff800000;
          auVar216._12_4_ = 0xff800000;
          auVar216._16_4_ = 0xff800000;
          auVar216._20_4_ = 0xff800000;
          auVar216._24_4_ = 0xff800000;
          auVar216._28_4_ = 0xff800000;
          _local_8a0 = auVar142;
          _local_7e0 = local_800;
        }
        else {
          auVar11 = vsqrtps_avx(auVar13);
          auVar171._0_4_ = fVar134 + fVar134;
          auVar171._4_4_ = fVar135 + fVar135;
          auVar171._8_4_ = fVar194 + fVar194;
          auVar171._12_4_ = fVar208 + fVar208;
          auVar171._16_4_ = fVar209 + fVar209;
          auVar171._20_4_ = fVar210 + fVar210;
          auVar171._24_4_ = fVar211 + fVar211;
          auVar171._28_4_ = fVar111 + fVar111;
          auVar144 = vrcpps_avx(auVar171);
          auVar125._8_4_ = 0x3f800000;
          auVar125._0_8_ = 0x3f8000003f800000;
          auVar125._12_4_ = 0x3f800000;
          auVar125._16_4_ = 0x3f800000;
          auVar125._20_4_ = 0x3f800000;
          auVar125._24_4_ = 0x3f800000;
          auVar125._28_4_ = 0x3f800000;
          auVar89 = vfnmadd213ps_fma(auVar171,auVar144,auVar125);
          auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar144,auVar144);
          auVar193._0_4_ = local_600._0_4_ ^ local_660;
          auVar193._4_4_ = local_600._4_4_ ^ uStack_65c;
          auVar193._8_4_ = (uint)fStack_5f8 ^ uStack_658;
          auVar193._12_4_ = (uint)fStack_5f4 ^ uStack_654;
          auVar193._16_4_ = (uint)fStack_5f0 ^ (uint)fStack_650;
          auVar193._20_4_ = (uint)fStack_5ec ^ (uint)fStack_64c;
          auVar193._24_4_ = (uint)fStack_5e8 ^ (uint)fStack_648;
          auVar193._28_4_ = (uint)fStack_5e4 ^ uStack_644;
          auVar144 = vsubps_avx(auVar193,auVar11);
          auVar11 = vsubps_avx(auVar11,_local_600);
          fVar111 = auVar144._0_4_ * auVar89._0_4_;
          fVar134 = auVar144._4_4_ * auVar89._4_4_;
          auVar55._4_4_ = fVar134;
          auVar55._0_4_ = fVar111;
          fVar135 = auVar144._8_4_ * auVar89._8_4_;
          auVar55._8_4_ = fVar135;
          fVar194 = auVar144._12_4_ * auVar89._12_4_;
          auVar55._12_4_ = fVar194;
          fVar208 = auVar144._16_4_ * 0.0;
          auVar55._16_4_ = fVar208;
          fVar209 = auVar144._20_4_ * 0.0;
          auVar55._20_4_ = fVar209;
          fVar210 = auVar144._24_4_ * 0.0;
          auVar55._24_4_ = fVar210;
          auVar55._28_4_ = auVar145._28_4_;
          fVar211 = auVar11._0_4_ * auVar89._0_4_;
          fVar212 = auVar11._4_4_ * auVar89._4_4_;
          auVar56._4_4_ = fVar212;
          auVar56._0_4_ = fVar211;
          fVar213 = auVar11._8_4_ * auVar89._8_4_;
          auVar56._8_4_ = fVar213;
          fVar175 = auVar11._12_4_ * auVar89._12_4_;
          auVar56._12_4_ = fVar175;
          fVar176 = auVar11._16_4_ * 0.0;
          auVar56._16_4_ = fVar176;
          fVar177 = auVar11._20_4_ * 0.0;
          auVar56._20_4_ = fVar177;
          fVar178 = auVar11._24_4_ * 0.0;
          auVar56._24_4_ = fVar178;
          auVar56._28_4_ = local_6a0._28_4_;
          auVar89 = vfmadd213ps_fma(local_3a0,auVar55,local_9a0);
          auVar200 = vfmadd213ps_fma(local_3a0,auVar56,local_9a0);
          auVar57._28_4_ = auVar144._28_4_;
          auVar57._0_28_ =
               ZEXT1628(CONCAT412(fVar136 * auVar89._12_4_,
                                  CONCAT48(fVar137 * auVar89._8_4_,
                                           CONCAT44(fVar133 * auVar89._4_4_,fVar132 * auVar89._0_4_)
                                          )));
          auVar145 = ZEXT1632(CONCAT412(fVar136 * auVar200._12_4_,
                                        CONCAT48(fVar137 * auVar200._8_4_,
                                                 CONCAT44(fVar133 * auVar200._4_4_,
                                                          fVar132 * auVar200._0_4_))));
          auVar89 = vfmadd213ps_fma(auVar14,auVar57,local_ae0);
          auVar200 = vfmadd213ps_fma(auVar14,auVar145,local_ae0);
          auVar222 = vfmadd213ps_fma(auVar15,auVar57,auVar98);
          auVar3 = vfmadd213ps_fma(auVar15,auVar145,auVar98);
          auVar4 = vfmadd213ps_fma(auVar57,auVar170,auVar232);
          auVar5 = vfmadd213ps_fma(auVar170,auVar145,auVar232);
          auVar58._4_4_ = (float)local_500._4_4_ * fVar134;
          auVar58._0_4_ = (float)local_500._0_4_ * fVar111;
          auVar58._8_4_ = fStack_4f8 * fVar135;
          auVar58._12_4_ = fStack_4f4 * fVar194;
          auVar58._16_4_ = fStack_4f0 * fVar208;
          auVar58._20_4_ = fStack_4ec * fVar209;
          auVar58._24_4_ = fStack_4e8 * fVar210;
          auVar58._28_4_ = 0;
          auVar144 = vsubps_avx(auVar58,ZEXT1632(auVar89));
          auVar172._0_4_ = (float)local_680._0_4_ * fVar111;
          auVar172._4_4_ = (float)local_680._4_4_ * fVar134;
          auVar172._8_4_ = fStack_678 * fVar135;
          auVar172._12_4_ = fStack_674 * fVar194;
          auVar172._16_4_ = fStack_670 * fVar208;
          auVar172._20_4_ = fStack_66c * fVar209;
          auVar172._24_4_ = fStack_668 * fVar210;
          auVar172._28_4_ = 0;
          auVar170 = vsubps_avx(auVar172,ZEXT1632(auVar222));
          auVar217._0_4_ = local_520 * fVar111;
          auVar217._4_4_ = fStack_51c * fVar134;
          auVar217._8_4_ = fStack_518 * fVar135;
          auVar217._12_4_ = fStack_514 * fVar194;
          auVar217._16_4_ = fStack_510 * fVar208;
          auVar217._20_4_ = fStack_50c * fVar209;
          auVar217._24_4_ = fStack_508 * fVar210;
          auVar217._28_4_ = 0;
          auVar145 = vsubps_avx(auVar217,ZEXT1632(auVar4));
          auVar186 = auVar145._0_28_;
          auVar59._4_4_ = (float)local_500._4_4_ * fVar212;
          auVar59._0_4_ = (float)local_500._0_4_ * fVar211;
          auVar59._8_4_ = fStack_4f8 * fVar213;
          auVar59._12_4_ = fStack_4f4 * fVar175;
          auVar59._16_4_ = fStack_4f0 * fVar176;
          auVar59._20_4_ = fStack_4ec * fVar177;
          auVar59._24_4_ = fStack_4e8 * fVar178;
          auVar59._28_4_ = 0;
          _local_7e0 = vsubps_avx(auVar59,ZEXT1632(auVar200));
          auVar60._4_4_ = fVar212 * (float)local_680._4_4_;
          auVar60._0_4_ = fVar211 * (float)local_680._0_4_;
          auVar60._8_4_ = fVar213 * fStack_678;
          auVar60._12_4_ = fVar175 * fStack_674;
          auVar60._16_4_ = fVar176 * fStack_670;
          auVar60._20_4_ = fVar177 * fStack_66c;
          auVar60._24_4_ = fVar178 * fStack_668;
          auVar60._28_4_ = local_7e0._28_4_;
          local_800 = vsubps_avx(auVar60,ZEXT1632(auVar3));
          auVar61._4_4_ = fStack_51c * fVar212;
          auVar61._0_4_ = local_520 * fVar211;
          auVar61._8_4_ = fStack_518 * fVar213;
          auVar61._12_4_ = fStack_514 * fVar175;
          auVar61._16_4_ = fStack_510 * fVar176;
          auVar61._20_4_ = fStack_50c * fVar177;
          auVar61._24_4_ = fStack_508 * fVar178;
          auVar61._28_4_ = local_800._28_4_;
          _local_820 = vsubps_avx(auVar61,ZEXT1632(auVar5));
          auVar13 = vcmpps_avx(auVar13,_DAT_01faff00,5);
          auVar218._8_4_ = 0x7f800000;
          auVar218._0_8_ = 0x7f8000007f800000;
          auVar218._12_4_ = 0x7f800000;
          auVar218._16_4_ = 0x7f800000;
          auVar218._20_4_ = 0x7f800000;
          auVar218._24_4_ = 0x7f800000;
          auVar218._28_4_ = 0x7f800000;
          auVar207 = vblendvps_avx(auVar218,auVar55,auVar13);
          auVar145 = vandps_avx(local_7c0,local_9c0);
          auVar145 = vmaxps_avx(local_420,auVar145);
          auVar62._4_4_ = auVar145._4_4_ * 1.9073486e-06;
          auVar62._0_4_ = auVar145._0_4_ * 1.9073486e-06;
          auVar62._8_4_ = auVar145._8_4_ * 1.9073486e-06;
          auVar62._12_4_ = auVar145._12_4_ * 1.9073486e-06;
          auVar62._16_4_ = auVar145._16_4_ * 1.9073486e-06;
          auVar62._20_4_ = auVar145._20_4_ * 1.9073486e-06;
          auVar62._24_4_ = auVar145._24_4_ * 1.9073486e-06;
          auVar62._28_4_ = auVar145._28_4_;
          auVar145 = vandps_avx(local_7c0,auVar16);
          auVar145 = vcmpps_avx(auVar145,auVar62,1);
          auVar219._8_4_ = 0xff800000;
          auVar219._0_8_ = 0xff800000ff800000;
          auVar219._12_4_ = 0xff800000;
          auVar219._16_4_ = 0xff800000;
          auVar219._20_4_ = 0xff800000;
          auVar219._24_4_ = 0xff800000;
          auVar219._28_4_ = 0xff800000;
          auVar216 = vblendvps_avx(auVar219,auVar56,auVar13);
          auVar16 = auVar13 & auVar145;
          if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar16 >> 0x7f,0) != '\0') ||
                (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar16 >> 0xbf,0) != '\0') ||
              (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar16[0x1f] < '\0') {
            auVar97 = vandps_avx(auVar145,auVar13);
            auVar145 = vcmpps_avx(auVar261,ZEXT832(0) << 0x20,2);
            auVar234 = ZEXT3264(auVar145);
            auVar130._8_4_ = 0xff800000;
            auVar130._0_8_ = 0xff800000ff800000;
            auVar130._12_4_ = 0xff800000;
            auVar130._16_4_ = 0xff800000;
            auVar130._20_4_ = 0xff800000;
            auVar130._24_4_ = 0xff800000;
            auVar130._28_4_ = 0xff800000;
            auVar255._8_4_ = 0x7f800000;
            auVar255._0_8_ = 0x7f8000007f800000;
            auVar255._12_4_ = 0x7f800000;
            auVar255._16_4_ = 0x7f800000;
            auVar255._20_4_ = 0x7f800000;
            auVar255._24_4_ = 0x7f800000;
            auVar255._28_4_ = 0x7f800000;
            auVar261 = vblendvps_avx(auVar255,auVar130,auVar145);
            auVar89 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
            auVar16 = vpmovsxwd_avx2(auVar89);
            auVar207 = vblendvps_avx(auVar207,auVar261,auVar16);
            auVar261 = vblendvps_avx(auVar130,auVar255,auVar145);
            auVar216 = vblendvps_avx(auVar216,auVar261,auVar16);
            auVar231._0_8_ = auVar97._0_8_ ^ 0xffffffffffffffff;
            auVar231._8_4_ = auVar97._8_4_ ^ 0xffffffff;
            auVar231._12_4_ = auVar97._12_4_ ^ 0xffffffff;
            auVar231._16_4_ = auVar97._16_4_ ^ 0xffffffff;
            auVar231._20_4_ = auVar97._20_4_ ^ 0xffffffff;
            auVar231._24_4_ = auVar97._24_4_ ^ 0xffffffff;
            auVar231._28_4_ = auVar97._28_4_ ^ 0xffffffff;
            auVar97 = vorps_avx(auVar145,auVar231);
            auVar97 = vandps_avx(auVar97,auVar13);
          }
        }
        auVar258 = ZEXT3264(local_a80);
        uVar84 = *(undefined4 *)&(ray->dir).field_0;
        local_5c0._4_4_ = uVar84;
        local_5c0._0_4_ = uVar84;
        local_5c0._8_4_ = uVar84;
        local_5c0._12_4_ = uVar84;
        local_5c0._16_4_ = uVar84;
        local_5c0._20_4_ = uVar84;
        local_5c0._24_4_ = uVar84;
        local_5c0._28_4_ = uVar84;
        uVar84 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
        local_5e0._4_4_ = uVar84;
        local_5e0._0_4_ = uVar84;
        local_5e0._8_4_ = uVar84;
        local_5e0._12_4_ = uVar84;
        local_5e0._16_4_ = uVar84;
        local_5e0._20_4_ = uVar84;
        local_5e0._24_4_ = uVar84;
        local_5e0._28_4_ = uVar84;
        auVar242 = ZEXT3264(local_5e0);
        fVar111 = (ray->dir).field_0.m128[2];
        auVar227 = ZEXT3264(_local_640);
        local_460 = _local_640;
        local_440 = vminps_avx(local_480,auVar207);
        local_7a0 = vmaxps_avx(_local_640,auVar216);
        local_4a0 = local_7a0;
        auVar261 = vcmpps_avx(_local_640,local_440,2);
        local_540 = vandps_avx(auVar261,local_940);
        auVar261 = vcmpps_avx(local_7a0,local_480,2);
        local_580 = vandps_avx(auVar261,local_940);
        auVar261 = vorps_avx(local_580,local_540);
        if ((((((((auVar261 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar261 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar261 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar261 >> 0x7f,0) != '\0') ||
              (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar261 >> 0xbf,0) != '\0') ||
            (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar261[0x1f] < '\0') {
          local_620._0_8_ = auVar97._0_8_ ^ 0xffffffffffffffff;
          local_620._8_4_ = auVar97._8_4_ ^ 0xffffffff;
          local_620._12_4_ = auVar97._12_4_ ^ 0xffffffff;
          local_620._16_4_ = auVar97._16_4_ ^ 0xffffffff;
          local_620._20_4_ = auVar97._20_4_ ^ 0xffffffff;
          local_620._24_4_ = auVar97._24_4_ ^ 0xffffffff;
          local_620._28_4_ = auVar97._28_4_ ^ 0xffffffff;
          auVar63._4_4_ = fVar111 * auVar186._4_4_;
          auVar63._0_4_ = fVar111 * auVar186._0_4_;
          auVar63._8_4_ = fVar111 * auVar186._8_4_;
          auVar63._12_4_ = fVar111 * auVar186._12_4_;
          auVar63._16_4_ = fVar111 * auVar186._16_4_;
          auVar63._20_4_ = fVar111 * auVar186._20_4_;
          auVar63._24_4_ = fVar111 * auVar186._24_4_;
          auVar63._28_4_ = auVar261._28_4_;
          auVar89 = vfmadd213ps_fma(auVar170,local_5e0,auVar63);
          auVar89 = vfmadd213ps_fma(auVar144,local_5c0,ZEXT1632(auVar89));
          auVar97 = vandps_avx(ZEXT1632(auVar89),local_7c0);
          auVar126._8_4_ = 0x3e99999a;
          auVar126._0_8_ = 0x3e99999a3e99999a;
          auVar126._12_4_ = 0x3e99999a;
          auVar126._16_4_ = 0x3e99999a;
          auVar126._20_4_ = 0x3e99999a;
          auVar126._24_4_ = 0x3e99999a;
          auVar126._28_4_ = 0x3e99999a;
          auVar97 = vcmpps_avx(auVar97,auVar126,1);
          auVar97 = vorps_avx(auVar97,local_620);
          auVar127._8_4_ = 3;
          auVar127._0_8_ = 0x300000003;
          auVar127._12_4_ = 3;
          auVar127._16_4_ = 3;
          auVar127._20_4_ = 3;
          auVar127._24_4_ = 3;
          auVar127._28_4_ = 3;
          auVar146._8_4_ = 2;
          auVar146._0_8_ = 0x200000002;
          auVar146._12_4_ = 2;
          auVar146._16_4_ = 2;
          auVar146._20_4_ = 2;
          auVar146._24_4_ = 2;
          auVar146._28_4_ = 2;
          auVar97 = vblendvps_avx(auVar146,auVar127,auVar97);
          local_5a0._4_4_ = local_b64;
          local_5a0._0_4_ = local_b64;
          local_5a0._8_4_ = local_b64;
          local_5a0._12_4_ = local_b64;
          local_5a0._16_4_ = local_b64;
          local_5a0._20_4_ = local_b64;
          local_5a0._24_4_ = local_b64;
          local_5a0._28_4_ = local_b64;
          local_560 = vpcmpgtd_avx2(auVar97,local_5a0);
          local_4e0 = vpandn_avx2(local_560,local_540);
          auVar227 = ZEXT3264(local_4e0);
          auVar97 = local_540 & ~local_560;
          if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar97 >> 0x7f,0) == '\0') &&
                (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar97 >> 0xbf,0) == '\0') &&
              (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar97[0x1f]) {
            fVar132 = ray->tfar;
            auVar102._4_4_ = fVar132;
            auVar102._0_4_ = fVar132;
            auVar102._8_4_ = fVar132;
            auVar102._12_4_ = fVar132;
            auVar102._16_4_ = fVar132;
            auVar102._20_4_ = fVar132;
            auVar102._24_4_ = fVar132;
            auVar102._28_4_ = fVar132;
            auVar97 = local_620;
            auVar261 = local_5c0;
            fVar132 = fVar111;
            fVar133 = fVar111;
            fVar134 = fVar111;
            fVar137 = fVar111;
            fVar135 = fVar111;
            fVar136 = fVar111;
            local_620 = ZEXT1632(auVar93);
            local_5e0 = auVar15;
            local_5c0 = auVar14;
            auStack_850 = auVar202._16_16_;
          }
          else {
            local_600._4_4_ = fVar111;
            local_600._0_4_ = fVar111;
            fStack_5f8 = fVar111;
            fStack_5f4 = fVar111;
            fStack_5f0 = fVar111;
            fStack_5ec = fVar111;
            fStack_5e8 = fVar111;
            fStack_5e4 = fVar111;
            auVar89 = vminps_avx(local_a20,local_a40);
            auVar93 = vmaxps_avx(local_a20,local_a40);
            auVar200 = vminps_avx(local_a30,_local_a50);
            auVar222 = vminps_avx(auVar89,auVar200);
            auVar89 = vmaxps_avx(local_a30,_local_a50);
            auVar200 = vmaxps_avx(auVar93,auVar89);
            local_860._8_4_ = 0x7fffffff;
            local_860._0_8_ = 0x7fffffff7fffffff;
            local_860._12_4_ = 0x7fffffff;
            auVar93 = vandps_avx(auVar222,local_860);
            auStack_850 = auVar202._16_16_;
            auVar89 = vandps_avx(auVar200,local_860);
            auVar93 = vmaxps_avx(auVar93,auVar89);
            auVar89 = vmovshdup_avx(auVar93);
            auVar89 = vmaxss_avx(auVar89,auVar93);
            auVar93 = vshufpd_avx(auVar93,auVar93,1);
            auVar93 = vmaxss_avx(auVar93,auVar89);
            local_940._0_4_ = auVar93._0_4_ * 1.9073486e-06;
            local_780 = vshufps_avx(auVar200,auVar200,0xff);
            local_9e0._4_4_ = (float)local_640._4_4_ + (float)local_880._4_4_;
            local_9e0._0_4_ = (float)local_640._0_4_ + (float)local_880._0_4_;
            fStack_9d8 = fStack_638 + fStack_878;
            fStack_9d4 = fStack_634 + fStack_874;
            fStack_9d0 = fStack_630 + fStack_870;
            fStack_9cc = fStack_62c + fStack_86c;
            fStack_9c8 = fStack_628 + fStack_868;
            fStack_9c4 = fStack_624 + fStack_864;
            do {
              auVar103._8_4_ = 0x7f800000;
              auVar103._0_8_ = 0x7f8000007f800000;
              auVar103._12_4_ = 0x7f800000;
              auVar103._16_4_ = 0x7f800000;
              auVar103._20_4_ = 0x7f800000;
              auVar103._24_4_ = 0x7f800000;
              auVar103._28_4_ = 0x7f800000;
              auVar97 = auVar227._0_32_;
              auVar261 = vblendvps_avx(auVar103,_local_640,auVar97);
              auVar145 = vshufps_avx(auVar261,auVar261,0xb1);
              auVar145 = vminps_avx(auVar261,auVar145);
              auVar13 = vshufpd_avx(auVar145,auVar145,5);
              auVar145 = vminps_avx(auVar145,auVar13);
              auVar13 = vpermpd_avx2(auVar145,0x4e);
              auVar145 = vminps_avx(auVar145,auVar13);
              auVar261 = vcmpps_avx(auVar261,auVar145,0);
              auVar145 = auVar97 & auVar261;
              if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar145 >> 0x7f,0) != '\0') ||
                    (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar145 >> 0xbf,0) != '\0') ||
                  (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar145[0x1f] < '\0') {
                auVar97 = vandps_avx(auVar261,auVar97);
              }
              uVar77 = vmovmskps_avx(auVar97);
              iVar17 = 0;
              for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
                iVar17 = iVar17 + 1;
              }
              uVar78 = iVar17 << 2;
              *(undefined4 *)(local_4e0 + uVar78) = 0;
              aVar1 = (ray->dir).field_0;
              local_9a0._0_16_ = (undefined1  [16])aVar1;
              auVar93 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
              uVar77 = *(uint *)(local_1a0 + uVar78);
              if (auVar93._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416(*(uint *)(local_460 + uVar78));
                fVar111 = sqrtf(auVar93._0_4_);
                auVar93 = local_ae0._0_16_;
              }
              else {
                auVar93 = vsqrtss_avx(auVar93,auVar93);
                fVar111 = auVar93._0_4_;
                auVar93 = ZEXT416(*(uint *)(local_460 + uVar78));
              }
              local_700._0_4_ = fVar111 * 1.9073486e-06;
              auVar93 = vinsertps_avx(auVar93,ZEXT416(uVar77),0x10);
              bVar83 = true;
              uVar79 = 0;
              do {
                local_960._0_16_ = vmovshdup_avx(auVar93);
                fVar137 = 1.0 - local_960._0_4_;
                auVar89 = vshufps_avx(auVar93,auVar93,0x55);
                fVar111 = auVar89._0_4_;
                auVar112._0_4_ = local_a40._0_4_ * fVar111;
                fVar132 = auVar89._4_4_;
                auVar112._4_4_ = local_a40._4_4_ * fVar132;
                fVar133 = auVar89._8_4_;
                auVar112._8_4_ = local_a40._8_4_ * fVar133;
                fVar134 = auVar89._12_4_;
                auVar112._12_4_ = local_a40._12_4_ * fVar134;
                auVar138._4_4_ = fVar137;
                auVar138._0_4_ = fVar137;
                auVar138._8_4_ = fVar137;
                auVar138._12_4_ = fVar137;
                auVar89 = vfmadd231ps_fma(auVar112,auVar138,local_a20);
                auVar151._0_4_ = local_a30._0_4_ * fVar111;
                auVar151._4_4_ = local_a30._4_4_ * fVar132;
                auVar151._8_4_ = local_a30._8_4_ * fVar133;
                auVar151._12_4_ = local_a30._12_4_ * fVar134;
                auVar200 = vfmadd231ps_fma(auVar151,auVar138,local_a40);
                auVar197._0_4_ = fVar111 * auVar200._0_4_;
                auVar197._4_4_ = fVar132 * auVar200._4_4_;
                auVar197._8_4_ = fVar133 * auVar200._8_4_;
                auVar197._12_4_ = fVar134 * auVar200._12_4_;
                auVar222 = vfmadd231ps_fma(auVar197,auVar138,auVar89);
                auVar113._0_4_ = fVar111 * (float)local_a50._0_4_;
                auVar113._4_4_ = fVar132 * (float)local_a50._4_4_;
                auVar113._8_4_ = fVar133 * fStack_a48;
                auVar113._12_4_ = fVar134 * fStack_a44;
                auVar89 = vfmadd231ps_fma(auVar113,auVar138,local_a30);
                auVar180._0_4_ = fVar111 * auVar89._0_4_;
                auVar180._4_4_ = fVar132 * auVar89._4_4_;
                auVar180._8_4_ = fVar133 * auVar89._8_4_;
                auVar180._12_4_ = fVar134 * auVar89._12_4_;
                local_ac0._0_16_ = vfmadd231ps_fma(auVar180,auVar138,auVar200);
                fVar135 = auVar93._0_4_;
                auVar114._4_4_ = fVar135;
                auVar114._0_4_ = fVar135;
                auVar114._8_4_ = fVar135;
                auVar114._12_4_ = fVar135;
                auVar89 = vfmadd213ps_fma(auVar114,local_9a0._0_16_,_DAT_01f7aa10);
                auVar88._0_4_ = fVar111 * local_ac0._0_4_;
                auVar88._4_4_ = fVar132 * local_ac0._4_4_;
                auVar88._8_4_ = fVar133 * local_ac0._8_4_;
                auVar88._12_4_ = fVar134 * local_ac0._12_4_;
                auVar200 = vfmadd231ps_fma(auVar88,auVar222,auVar138);
                local_6e0._0_16_ = auVar200;
                auVar89 = vsubps_avx(auVar89,auVar200);
                _local_8a0 = auVar89;
                auVar89 = vdpps_avx(auVar89,auVar89,0x7f);
                local_ae0._0_16_ = auVar89;
                if (auVar89._0_4_ < 0.0) {
                  local_980._0_16_ = ZEXT416((uint)fVar137);
                  local_aa0._0_16_ = auVar222;
                  auVar109._0_4_ = sqrtf(auVar89._0_4_);
                  auVar109._4_60_ = extraout_var;
                  auVar89 = auVar109._0_16_;
                  auVar222 = local_aa0._0_16_;
                  auVar200 = local_980._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar89,auVar89);
                  auVar200 = ZEXT416((uint)fVar137);
                }
                auVar222 = vsubps_avx(local_ac0._0_16_,auVar222);
                auVar214._0_4_ = auVar222._0_4_ * 3.0;
                auVar214._4_4_ = auVar222._4_4_ * 3.0;
                auVar214._8_4_ = auVar222._8_4_ * 3.0;
                auVar214._12_4_ = auVar222._12_4_ * 3.0;
                auVar222 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar200,local_960._0_16_)
                ;
                auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_960._0_16_,auVar200);
                fVar111 = auVar200._0_4_ * 6.0;
                fVar132 = auVar222._0_4_ * 6.0;
                fVar133 = auVar3._0_4_ * 6.0;
                fVar134 = local_960._0_4_ * 6.0;
                auVar152._0_4_ = fVar134 * (float)local_a50._0_4_;
                auVar152._4_4_ = fVar134 * (float)local_a50._4_4_;
                auVar152._8_4_ = fVar134 * fStack_a48;
                auVar152._12_4_ = fVar134 * fStack_a44;
                auVar115._4_4_ = fVar133;
                auVar115._0_4_ = fVar133;
                auVar115._8_4_ = fVar133;
                auVar115._12_4_ = fVar133;
                auVar200 = vfmadd132ps_fma(auVar115,auVar152,local_a30);
                auVar153._4_4_ = fVar132;
                auVar153._0_4_ = fVar132;
                auVar153._8_4_ = fVar132;
                auVar153._12_4_ = fVar132;
                auVar200 = vfmadd132ps_fma(auVar153,auVar200,local_a40);
                auVar222 = vdpps_avx(auVar214,auVar214,0x7f);
                auVar116._4_4_ = fVar111;
                auVar116._0_4_ = fVar111;
                auVar116._8_4_ = fVar111;
                auVar116._12_4_ = fVar111;
                auVar4 = vfmadd132ps_fma(auVar116,auVar200,local_a20);
                auVar200 = vblendps_avx(auVar222,_DAT_01f7aa10,0xe);
                auVar3 = vrsqrtss_avx(auVar200,auVar200);
                fVar133 = auVar222._0_4_;
                fVar111 = auVar3._0_4_;
                auVar3 = vdpps_avx(auVar214,auVar4,0x7f);
                fVar111 = fVar111 * 1.5 + fVar133 * -0.5 * fVar111 * fVar111 * fVar111;
                auVar117._0_4_ = auVar4._0_4_ * fVar133;
                auVar117._4_4_ = auVar4._4_4_ * fVar133;
                auVar117._8_4_ = auVar4._8_4_ * fVar133;
                auVar117._12_4_ = auVar4._12_4_ * fVar133;
                fVar132 = auVar3._0_4_;
                auVar198._0_4_ = auVar214._0_4_ * fVar132;
                auVar198._4_4_ = auVar214._4_4_ * fVar132;
                auVar198._8_4_ = auVar214._8_4_ * fVar132;
                auVar198._12_4_ = auVar214._12_4_ * fVar132;
                auVar3 = vsubps_avx(auVar117,auVar198);
                auVar200 = vrcpss_avx(auVar200,auVar200);
                auVar4 = vfnmadd213ss_fma(auVar200,auVar222,ZEXT416(0x40000000));
                fVar132 = auVar200._0_4_ * auVar4._0_4_;
                auVar200 = vmaxss_avx(ZEXT416((uint)local_940._0_4_),
                                      ZEXT416((uint)(fVar135 * (float)local_700._0_4_)));
                auVar227 = ZEXT1664(auVar200);
                uVar65 = CONCAT44(auVar214._4_4_,auVar214._0_4_);
                local_ac0._0_8_ = uVar65 ^ 0x8000000080000000;
                local_ac0._8_4_ = -auVar214._8_4_;
                local_ac0._12_4_ = -auVar214._12_4_;
                auVar154._0_4_ = fVar111 * auVar3._0_4_ * fVar132;
                auVar154._4_4_ = fVar111 * auVar3._4_4_ * fVar132;
                auVar154._8_4_ = fVar111 * auVar3._8_4_ * fVar132;
                auVar154._12_4_ = fVar111 * auVar3._12_4_ * fVar132;
                local_8c0._0_4_ = auVar214._0_4_ * fVar111;
                local_8c0._4_4_ = auVar214._4_4_ * fVar111;
                local_8c0._8_4_ = auVar214._8_4_ * fVar111;
                local_8c0._12_4_ = auVar214._12_4_ * fVar111;
                local_960._0_16_ = auVar214;
                local_980._0_4_ = auVar200._0_4_;
                if (fVar133 < -fVar133) {
                  local_aa0._0_4_ = auVar89._0_4_;
                  local_9c0._0_16_ = auVar154;
                  fVar111 = sqrtf(fVar133);
                  auVar89 = ZEXT416((uint)local_aa0._0_4_);
                  auVar227 = ZEXT464((uint)local_980._0_4_);
                  auVar154 = local_9c0._0_16_;
                }
                else {
                  auVar200 = vsqrtss_avx(auVar222,auVar222);
                  fVar111 = auVar200._0_4_;
                }
                auVar200 = vdpps_avx(_local_8a0,local_8c0._0_16_,0x7f);
                auVar5 = vfmadd213ss_fma(ZEXT416((uint)local_940._0_4_),auVar89,auVar227._0_16_);
                auVar222 = vdpps_avx(local_ac0._0_16_,local_8c0._0_16_,0x7f);
                auVar3 = vdpps_avx(_local_8a0,auVar154,0x7f);
                auVar4 = vdpps_avx(local_9a0._0_16_,local_8c0._0_16_,0x7f);
                auVar89 = vfmadd213ss_fma(ZEXT416((uint)(auVar89._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_940._0_4_ / fVar111)),auVar5);
                local_aa0._0_4_ = auVar89._0_4_;
                auVar90._0_4_ = auVar200._0_4_ * auVar200._0_4_;
                auVar90._4_4_ = auVar200._4_4_ * auVar200._4_4_;
                auVar90._8_4_ = auVar200._8_4_ * auVar200._8_4_;
                auVar90._12_4_ = auVar200._12_4_ * auVar200._12_4_;
                auVar89 = vdpps_avx(_local_8a0,local_ac0._0_16_,0x7f);
                auVar6 = vsubps_avx(local_ae0._0_16_,auVar90);
                auVar5 = vrsqrtss_avx(auVar6,auVar6);
                fVar132 = auVar6._0_4_;
                fVar111 = auVar5._0_4_;
                fVar111 = fVar111 * 1.5 + fVar132 * -0.5 * fVar111 * fVar111 * fVar111;
                auVar5 = vdpps_avx(_local_8a0,local_9a0._0_16_,0x7f);
                local_ac0._0_16_ = ZEXT416((uint)(auVar222._0_4_ + auVar3._0_4_));
                local_8c0._0_16_ = vfnmadd231ss_fma(auVar89,auVar200,local_ac0._0_16_);
                auVar89 = vfnmadd231ss_fma(auVar5,auVar200,auVar4);
                if (fVar132 < 0.0) {
                  local_9c0._0_16_ = auVar200;
                  local_720._0_16_ = auVar4;
                  local_740._0_4_ = fVar111;
                  local_760._0_16_ = auVar89;
                  fVar132 = sqrtf(fVar132);
                  auVar227 = ZEXT464((uint)local_980._0_4_);
                  fVar111 = (float)local_740._0_4_;
                  auVar89 = local_760._0_16_;
                  auVar4 = local_720._0_16_;
                  auVar200 = local_9c0._0_16_;
                }
                else {
                  auVar222 = vsqrtss_avx(auVar6,auVar6);
                  fVar132 = auVar222._0_4_;
                }
                auVar234 = ZEXT3264(auVar225);
                auVar222 = vpermilps_avx(local_6e0._0_16_,0xff);
                fVar132 = fVar132 - auVar222._0_4_;
                auVar3 = vshufps_avx(local_960._0_16_,local_960._0_16_,0xff);
                auVar222 = vfmsub213ss_fma(local_8c0._0_16_,ZEXT416((uint)fVar111),auVar3);
                auVar155._0_8_ = auVar4._0_8_ ^ 0x8000000080000000;
                auVar155._8_4_ = auVar4._8_4_ ^ 0x80000000;
                auVar155._12_4_ = auVar4._12_4_ ^ 0x80000000;
                auVar181._0_8_ = auVar222._0_8_ ^ 0x8000000080000000;
                auVar181._8_4_ = auVar222._8_4_ ^ 0x80000000;
                auVar181._12_4_ = auVar222._12_4_ ^ 0x80000000;
                auVar89 = ZEXT416((uint)(auVar89._0_4_ * fVar111));
                auVar222 = vfmsub231ss_fma(ZEXT416((uint)(auVar4._0_4_ * auVar222._0_4_)),
                                           local_ac0._0_16_,auVar89);
                auVar89 = vinsertps_avx(auVar181,auVar89,0x1c);
                uVar84 = auVar222._0_4_;
                auVar182._4_4_ = uVar84;
                auVar182._0_4_ = uVar84;
                auVar182._8_4_ = uVar84;
                auVar182._12_4_ = uVar84;
                auVar89 = vdivps_avx(auVar89,auVar182);
                auVar222 = vinsertps_avx(local_ac0._0_16_,auVar155,0x10);
                auVar222 = vdivps_avx(auVar222,auVar182);
                fVar111 = auVar200._0_4_;
                auVar139._0_4_ = fVar111 * auVar89._0_4_ + fVar132 * auVar222._0_4_;
                auVar139._4_4_ = fVar111 * auVar89._4_4_ + fVar132 * auVar222._4_4_;
                auVar139._8_4_ = fVar111 * auVar89._8_4_ + fVar132 * auVar222._8_4_;
                auVar139._12_4_ = fVar111 * auVar89._12_4_ + fVar132 * auVar222._12_4_;
                auVar93 = vsubps_avx(auVar93,auVar139);
                auVar89 = vandps_avx(auVar200,local_860);
                if (auVar89._0_4_ < (float)local_aa0._0_4_) {
                  auVar200 = vfmadd231ss_fma(ZEXT416((uint)(auVar227._0_4_ + (float)local_aa0._0_4_)
                                                    ),local_780,ZEXT416(0x36000000));
                  auVar89 = vandps_avx(ZEXT416((uint)fVar132),local_860);
                  if (auVar89._0_4_ < auVar200._0_4_) {
                    fVar111 = auVar93._0_4_ + (float)local_840._0_4_;
                    bVar74 = 0;
                    if ((fVar111 < (ray->org).field_0.m128[3]) ||
                       (fVar132 = ray->tfar, fVar132 < fVar111)) goto LAB_01808b7b;
                    auVar93 = vmovshdup_avx(auVar93);
                    bVar74 = 0;
                    fVar133 = auVar93._0_4_;
                    auVar250 = ZEXT3264(local_920);
                    if ((fVar133 < 0.0) ||
                       (auVar258 = ZEXT3264(local_a80), bVar74 = 0, 1.0 < fVar133))
                    goto LAB_01808b7b;
                    auVar93 = vrsqrtss_avx(local_ae0._0_16_,local_ae0._0_16_);
                    fVar134 = auVar93._0_4_;
                    pGVar8 = (context->scene->geometries).items[uVar75].ptr;
                    if ((pGVar8->mask & ray->mask) == 0) {
                      bVar74 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar74 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      fVar134 = fVar134 * 1.5 + local_ae0._0_4_ * -0.5 * fVar134 * fVar134 * fVar134
                      ;
                      auVar156._0_4_ = fVar134 * (float)local_8a0._0_4_;
                      auVar156._4_4_ = fVar134 * (float)local_8a0._4_4_;
                      auVar156._8_4_ = fVar134 * fStack_898;
                      auVar156._12_4_ = fVar134 * fStack_894;
                      auVar222 = vfmadd213ps_fma(auVar3,auVar156,local_960._0_16_);
                      auVar93 = vshufps_avx(auVar156,auVar156,0xc9);
                      auVar89 = vshufps_avx(local_960._0_16_,local_960._0_16_,0xc9);
                      auVar157._0_4_ = auVar156._0_4_ * auVar89._0_4_;
                      auVar157._4_4_ = auVar156._4_4_ * auVar89._4_4_;
                      auVar157._8_4_ = auVar156._8_4_ * auVar89._8_4_;
                      auVar157._12_4_ = auVar156._12_4_ * auVar89._12_4_;
                      auVar200 = vfmsub231ps_fma(auVar157,local_960._0_16_,auVar93);
                      auVar93 = vshufps_avx(auVar200,auVar200,0xc9);
                      auVar89 = vshufps_avx(auVar222,auVar222,0xc9);
                      auVar200 = vshufps_avx(auVar200,auVar200,0xd2);
                      auVar91._0_4_ = auVar222._0_4_ * auVar200._0_4_;
                      auVar91._4_4_ = auVar222._4_4_ * auVar200._4_4_;
                      auVar91._8_4_ = auVar222._8_4_ * auVar200._8_4_;
                      auVar91._12_4_ = auVar222._12_4_ * auVar200._12_4_;
                      auVar89 = vfmsub231ps_fma(auVar91,auVar93,auVar89);
                      auVar93 = vshufps_avx(auVar89,auVar89,0xe9);
                      local_900 = vmovlps_avx(auVar93);
                      local_8f8 = auVar89._0_4_;
                      local_8f0 = 0;
                      local_8ec = (undefined4)local_8c8;
                      local_8e4 = context->user->instID[0];
                      local_8e0 = context->user->instPrimID[0];
                      ray->tfar = fVar111;
                      local_6c0._0_4_ = 0xffffffff;
                      local_a10.valid = (int *)local_6c0;
                      local_a10.geometryUserPtr = pGVar8->userPtr;
                      local_a10.context = context->user;
                      local_a10.hit = (RTCHitN *)&local_900;
                      local_a10.N = 1;
                      local_a10.ray = (RTCRayN *)ray;
                      local_8f4 = fVar133;
                      local_8e8 = uVar75;
                      if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01808d99:
                        p_Var9 = context->args->filter;
                        if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar234 = ZEXT1664(auVar234._0_16_);
                          (*p_Var9)(&local_a10);
                          if (*local_a10.valid == 0) goto LAB_01808ddd;
                        }
                        bVar74 = 1;
                      }
                      else {
                        auVar234 = ZEXT1664(auVar221);
                        (*pGVar8->occlusionFilterN)(&local_a10);
                        if (*local_a10.valid != 0) goto LAB_01808d99;
LAB_01808ddd:
                        ray->tfar = fVar132;
                        bVar74 = 0;
                      }
                      auVar258 = ZEXT3264(local_a80);
                      auVar250 = ZEXT3264(local_920);
                    }
                    goto LAB_01808b7f;
                  }
                }
                bVar83 = uVar79 < 4;
                uVar79 = uVar79 + 1;
              } while (uVar79 != 5);
              bVar83 = false;
              bVar74 = 5;
LAB_01808b7b:
              auVar258 = ZEXT3264(local_a80);
              auVar250 = ZEXT3264(local_920);
LAB_01808b7f:
              bVar80 = (bool)(bVar80 | bVar83 & bVar74);
              fVar111 = ray->tfar;
              auVar102._4_4_ = fVar111;
              auVar102._0_4_ = fVar111;
              auVar102._8_4_ = fVar111;
              auVar102._12_4_ = fVar111;
              auVar102._16_4_ = fVar111;
              auVar102._20_4_ = fVar111;
              auVar102._24_4_ = fVar111;
              auVar102._28_4_ = fVar111;
              auVar261 = vcmpps_avx(_local_9e0,auVar102,2);
              auVar97 = vandps_avx(auVar261,local_4e0);
              auVar227 = ZEXT3264(auVar97);
              auVar261 = local_4e0 & auVar261;
              local_4e0 = auVar97;
            } while ((((((((auVar261 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar261 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar261 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar261 >> 0x7f,0) != '\0') ||
                       (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar261 >> 0xbf,0) != '\0') ||
                     (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar261[0x1f] < '\0');
            auVar242 = ZEXT3264(local_5e0);
            auVar97 = local_620;
            auVar261 = local_5c0;
            fVar111 = (float)local_600._0_4_;
            fVar132 = (float)local_600._4_4_;
            fVar133 = fStack_5f8;
            fVar134 = fStack_5f4;
            fVar137 = fStack_5f0;
            fVar135 = fStack_5ec;
            fVar136 = fStack_5e8;
          }
          auVar131._0_4_ = fVar111 * (float)local_820._0_4_;
          auVar131._4_4_ = fVar132 * (float)local_820._4_4_;
          auVar131._8_4_ = fVar133 * fStack_818;
          auVar131._12_4_ = fVar134 * fStack_814;
          auVar131._16_4_ = fVar137 * fStack_810;
          auVar131._20_4_ = fVar135 * fStack_80c;
          auVar131._28_36_ = auVar227._28_36_;
          auVar131._24_4_ = fVar136 * fStack_808;
          auVar93 = vfmadd213ps_fma(local_800,auVar242._0_32_,auVar131._0_32_);
          auVar93 = vfmadd213ps_fma(_local_7e0,auVar261,ZEXT1632(auVar93));
          auVar261 = vandps_avx(ZEXT1632(auVar93),local_7c0);
          auVar147._8_4_ = 0x3e99999a;
          auVar147._0_8_ = 0x3e99999a3e99999a;
          auVar147._12_4_ = 0x3e99999a;
          auVar147._16_4_ = 0x3e99999a;
          auVar147._20_4_ = 0x3e99999a;
          auVar147._24_4_ = 0x3e99999a;
          auVar147._28_4_ = 0x3e99999a;
          auVar261 = vcmpps_avx(auVar261,auVar147,1);
          auVar261 = vorps_avx(auVar261,auVar97);
          auVar148._0_4_ = (float)local_880._0_4_ + local_7a0._0_4_;
          auVar148._4_4_ = (float)local_880._4_4_ + local_7a0._4_4_;
          auVar148._8_4_ = fStack_878 + local_7a0._8_4_;
          auVar148._12_4_ = fStack_874 + local_7a0._12_4_;
          auVar148._16_4_ = fStack_870 + local_7a0._16_4_;
          auVar148._20_4_ = fStack_86c + local_7a0._20_4_;
          auVar148._24_4_ = fStack_868 + local_7a0._24_4_;
          auVar148._28_4_ = fStack_864 + local_7a0._28_4_;
          auVar97 = vcmpps_avx(auVar148,auVar102,2);
          local_800 = vandps_avx(auVar97,local_580);
          auVar227 = ZEXT3264(local_800);
          auVar149._8_4_ = 3;
          auVar149._0_8_ = 0x300000003;
          auVar149._12_4_ = 3;
          auVar149._16_4_ = 3;
          auVar149._20_4_ = 3;
          auVar149._24_4_ = 3;
          auVar149._28_4_ = 3;
          auVar173._8_4_ = 2;
          auVar173._0_8_ = 0x200000002;
          auVar173._12_4_ = 2;
          auVar173._16_4_ = 2;
          auVar173._20_4_ = 2;
          auVar173._24_4_ = 2;
          auVar173._28_4_ = 2;
          auVar97 = vblendvps_avx(auVar173,auVar149,auVar261);
          _local_820 = vpcmpgtd_avx2(auVar97,local_5a0);
          auVar97 = vpandn_avx2(_local_820,local_800);
          auVar261 = local_800 & ~_local_820;
          local_6c0 = auVar97;
          if ((((((((auVar261 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar261 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar261 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar261 >> 0x7f,0) != '\0') ||
                (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar261 >> 0xbf,0) != '\0') ||
              (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar261[0x1f] < '\0') {
            auVar89 = vminps_avx(local_a20,local_a40);
            auVar93 = vmaxps_avx(local_a20,local_a40);
            auVar200 = vminps_avx(local_a30,_local_a50);
            auVar222 = vminps_avx(auVar89,auVar200);
            auVar89 = vmaxps_avx(local_a30,_local_a50);
            auVar200 = vmaxps_avx(auVar93,auVar89);
            local_860._8_4_ = 0x7fffffff;
            local_860._0_8_ = 0x7fffffff7fffffff;
            local_860._12_4_ = 0x7fffffff;
            auVar93 = vandps_avx(auVar222,local_860);
            auVar89 = vandps_avx(auVar200,local_860);
            auVar93 = vmaxps_avx(auVar93,auVar89);
            auVar89 = vmovshdup_avx(auVar93);
            auVar89 = vmaxss_avx(auVar89,auVar93);
            auVar93 = vshufpd_avx(auVar93,auVar93,1);
            auVar93 = vmaxss_avx(auVar93,auVar89);
            local_940._0_4_ = auVar93._0_4_ * 1.9073486e-06;
            local_780 = vshufps_avx(auVar200,auVar200,0xff);
            local_7e0._4_4_ = (float)local_880._4_4_ + local_4a0._4_4_;
            local_7e0._0_4_ = (float)local_880._0_4_ + local_4a0._0_4_;
            fStack_7d8 = fStack_878 + local_4a0._8_4_;
            fStack_7d4 = fStack_874 + local_4a0._12_4_;
            fStack_7d0 = fStack_870 + local_4a0._16_4_;
            fStack_7cc = fStack_86c + local_4a0._20_4_;
            fStack_7c8 = fStack_868 + local_4a0._24_4_;
            fStack_7c4 = fStack_864 + local_4a0._28_4_;
            _local_9e0 = local_4a0;
            do {
              auVar104._8_4_ = 0x7f800000;
              auVar104._0_8_ = 0x7f8000007f800000;
              auVar104._12_4_ = 0x7f800000;
              auVar104._16_4_ = 0x7f800000;
              auVar104._20_4_ = 0x7f800000;
              auVar104._24_4_ = 0x7f800000;
              auVar104._28_4_ = 0x7f800000;
              auVar261 = vblendvps_avx(auVar104,_local_9e0,auVar97);
              auVar145 = vshufps_avx(auVar261,auVar261,0xb1);
              auVar145 = vminps_avx(auVar261,auVar145);
              auVar13 = vshufpd_avx(auVar145,auVar145,5);
              auVar145 = vminps_avx(auVar145,auVar13);
              auVar13 = vpermpd_avx2(auVar145,0x4e);
              auVar145 = vminps_avx(auVar145,auVar13);
              auVar145 = vcmpps_avx(auVar261,auVar145,0);
              auVar13 = auVar97 & auVar145;
              auVar261 = auVar97;
              if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar13 >> 0x7f,0) != '\0') ||
                    (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0xbf,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar13[0x1f] < '\0') {
                auVar261 = vandps_avx(auVar145,auVar97);
              }
              uVar77 = vmovmskps_avx(auVar261);
              iVar17 = 0;
              for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
                iVar17 = iVar17 + 1;
              }
              uVar78 = iVar17 << 2;
              local_6c0 = auVar97;
              *(undefined4 *)(local_6c0 + uVar78) = 0;
              aVar1 = (ray->dir).field_0;
              local_9a0._0_16_ = (undefined1  [16])aVar1;
              auVar93 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
              uVar77 = *(uint *)(local_1c0 + uVar78);
              if (auVar93._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416(*(uint *)(local_480 + uVar78));
                fVar111 = sqrtf(auVar93._0_4_);
                auVar93 = local_ae0._0_16_;
              }
              else {
                auVar93 = vsqrtss_avx(auVar93,auVar93);
                fVar111 = auVar93._0_4_;
                auVar93 = ZEXT416(*(uint *)(local_480 + uVar78));
              }
              local_700._0_4_ = fVar111 * 1.9073486e-06;
              auVar93 = vinsertps_avx(auVar93,ZEXT416(uVar77),0x10);
              auVar227 = ZEXT1664(auVar93);
              bVar83 = true;
              uVar79 = 0;
              do {
                auVar222 = auVar227._0_16_;
                local_960._0_16_ = vmovshdup_avx(auVar222);
                fVar137 = 1.0 - local_960._0_4_;
                auVar93 = vshufps_avx(auVar222,auVar222,0x55);
                fVar111 = auVar93._0_4_;
                auVar118._0_4_ = local_a40._0_4_ * fVar111;
                fVar132 = auVar93._4_4_;
                auVar118._4_4_ = local_a40._4_4_ * fVar132;
                fVar133 = auVar93._8_4_;
                auVar118._8_4_ = local_a40._8_4_ * fVar133;
                fVar134 = auVar93._12_4_;
                auVar118._12_4_ = local_a40._12_4_ * fVar134;
                auVar140._4_4_ = fVar137;
                auVar140._0_4_ = fVar137;
                auVar140._8_4_ = fVar137;
                auVar140._12_4_ = fVar137;
                auVar93 = vfmadd231ps_fma(auVar118,auVar140,local_a20);
                auVar158._0_4_ = local_a30._0_4_ * fVar111;
                auVar158._4_4_ = local_a30._4_4_ * fVar132;
                auVar158._8_4_ = local_a30._8_4_ * fVar133;
                auVar158._12_4_ = local_a30._12_4_ * fVar134;
                auVar89 = vfmadd231ps_fma(auVar158,auVar140,local_a40);
                auVar199._0_4_ = fVar111 * auVar89._0_4_;
                auVar199._4_4_ = fVar132 * auVar89._4_4_;
                auVar199._8_4_ = fVar133 * auVar89._8_4_;
                auVar199._12_4_ = fVar134 * auVar89._12_4_;
                auVar200 = vfmadd231ps_fma(auVar199,auVar140,auVar93);
                auVar119._0_4_ = fVar111 * (float)local_a50._0_4_;
                auVar119._4_4_ = fVar132 * (float)local_a50._4_4_;
                auVar119._8_4_ = fVar133 * fStack_a48;
                auVar119._12_4_ = fVar134 * fStack_a44;
                auVar93 = vfmadd231ps_fma(auVar119,auVar140,local_a30);
                auVar183._0_4_ = fVar111 * auVar93._0_4_;
                auVar183._4_4_ = fVar132 * auVar93._4_4_;
                auVar183._8_4_ = fVar133 * auVar93._8_4_;
                auVar183._12_4_ = fVar134 * auVar93._12_4_;
                local_ac0._0_16_ = vfmadd231ps_fma(auVar183,auVar140,auVar89);
                uVar84 = auVar227._0_4_;
                auVar120._4_4_ = uVar84;
                auVar120._0_4_ = uVar84;
                auVar120._8_4_ = uVar84;
                auVar120._12_4_ = uVar84;
                auVar93 = vfmadd213ps_fma(auVar120,local_9a0._0_16_,_DAT_01f7aa10);
                auVar92._0_4_ = fVar111 * local_ac0._0_4_;
                auVar92._4_4_ = fVar132 * local_ac0._4_4_;
                auVar92._8_4_ = fVar133 * local_ac0._8_4_;
                auVar92._12_4_ = fVar134 * local_ac0._12_4_;
                auVar89 = vfmadd231ps_fma(auVar92,auVar200,auVar140);
                local_6e0._0_16_ = auVar89;
                auVar93 = vsubps_avx(auVar93,auVar89);
                _local_8a0 = auVar93;
                auVar93 = vdpps_avx(auVar93,auVar93,0x7f);
                local_ae0._0_16_ = auVar93;
                if (auVar93._0_4_ < 0.0) {
                  local_980._0_16_ = ZEXT416((uint)fVar137);
                  local_aa0._0_16_ = auVar200;
                  auVar110._0_4_ = sqrtf(auVar93._0_4_);
                  auVar110._4_60_ = extraout_var_00;
                  auVar227 = ZEXT1664(auVar222);
                  auVar93 = auVar110._0_16_;
                  auVar200 = local_aa0._0_16_;
                  auVar89 = local_980._0_16_;
                }
                else {
                  auVar93 = vsqrtss_avx(auVar93,auVar93);
                  auVar89 = ZEXT416((uint)fVar137);
                }
                auVar200 = vsubps_avx(local_ac0._0_16_,auVar200);
                auVar215._0_4_ = auVar200._0_4_ * 3.0;
                auVar215._4_4_ = auVar200._4_4_ * 3.0;
                auVar215._8_4_ = auVar200._8_4_ * 3.0;
                auVar215._12_4_ = auVar200._12_4_ * 3.0;
                auVar200 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar89,local_960._0_16_);
                auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_960._0_16_,auVar89);
                fVar111 = auVar89._0_4_ * 6.0;
                fVar132 = auVar200._0_4_ * 6.0;
                fVar133 = auVar3._0_4_ * 6.0;
                fVar134 = local_960._0_4_ * 6.0;
                auVar159._0_4_ = fVar134 * (float)local_a50._0_4_;
                auVar159._4_4_ = fVar134 * (float)local_a50._4_4_;
                auVar159._8_4_ = fVar134 * fStack_a48;
                auVar159._12_4_ = fVar134 * fStack_a44;
                auVar121._4_4_ = fVar133;
                auVar121._0_4_ = fVar133;
                auVar121._8_4_ = fVar133;
                auVar121._12_4_ = fVar133;
                auVar89 = vfmadd132ps_fma(auVar121,auVar159,local_a30);
                auVar160._4_4_ = fVar132;
                auVar160._0_4_ = fVar132;
                auVar160._8_4_ = fVar132;
                auVar160._12_4_ = fVar132;
                auVar89 = vfmadd132ps_fma(auVar160,auVar89,local_a40);
                auVar200 = vdpps_avx(auVar215,auVar215,0x7f);
                auVar122._4_4_ = fVar111;
                auVar122._0_4_ = fVar111;
                auVar122._8_4_ = fVar111;
                auVar122._12_4_ = fVar111;
                auVar4 = vfmadd132ps_fma(auVar122,auVar89,local_a20);
                auVar89 = vblendps_avx(auVar200,_DAT_01f7aa10,0xe);
                auVar3 = vrsqrtss_avx(auVar89,auVar89);
                fVar133 = auVar200._0_4_;
                fVar111 = auVar3._0_4_;
                auVar3 = vdpps_avx(auVar215,auVar4,0x7f);
                fVar111 = fVar111 * 1.5 + fVar133 * -0.5 * fVar111 * fVar111 * fVar111;
                auVar123._0_4_ = auVar4._0_4_ * fVar133;
                auVar123._4_4_ = auVar4._4_4_ * fVar133;
                auVar123._8_4_ = auVar4._8_4_ * fVar133;
                auVar123._12_4_ = auVar4._12_4_ * fVar133;
                fVar132 = auVar3._0_4_;
                auVar201._0_4_ = auVar215._0_4_ * fVar132;
                auVar201._4_4_ = auVar215._4_4_ * fVar132;
                auVar201._8_4_ = auVar215._8_4_ * fVar132;
                auVar201._12_4_ = auVar215._12_4_ * fVar132;
                auVar3 = vsubps_avx(auVar123,auVar201);
                auVar89 = vrcpss_avx(auVar89,auVar89);
                auVar4 = vfnmadd213ss_fma(auVar89,auVar200,ZEXT416(0x40000000));
                fVar132 = auVar89._0_4_ * auVar4._0_4_;
                auVar89 = vmaxss_avx(ZEXT416((uint)local_940._0_4_),
                                     ZEXT416((uint)(auVar227._0_4_ * (float)local_700._0_4_)));
                auVar242 = ZEXT1664(auVar89);
                uVar65 = CONCAT44(auVar215._4_4_,auVar215._0_4_);
                local_ac0._0_8_ = uVar65 ^ 0x8000000080000000;
                local_ac0._8_4_ = -auVar215._8_4_;
                local_ac0._12_4_ = -auVar215._12_4_;
                auVar161._0_4_ = fVar111 * auVar3._0_4_ * fVar132;
                auVar161._4_4_ = fVar111 * auVar3._4_4_ * fVar132;
                auVar161._8_4_ = fVar111 * auVar3._8_4_ * fVar132;
                auVar161._12_4_ = fVar111 * auVar3._12_4_ * fVar132;
                local_8c0._0_4_ = auVar215._0_4_ * fVar111;
                local_8c0._4_4_ = auVar215._4_4_ * fVar111;
                local_8c0._8_4_ = auVar215._8_4_ * fVar111;
                local_8c0._12_4_ = auVar215._12_4_ * fVar111;
                local_960._0_16_ = auVar215;
                local_980._0_4_ = auVar89._0_4_;
                if (fVar133 < -fVar133) {
                  local_aa0._0_4_ = auVar93._0_4_;
                  local_9c0._0_16_ = auVar161;
                  fVar111 = sqrtf(fVar133);
                  auVar93 = ZEXT416((uint)local_aa0._0_4_);
                  auVar242 = ZEXT464((uint)local_980._0_4_);
                  auVar161 = local_9c0._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar200,auVar200);
                  fVar111 = auVar89._0_4_;
                }
                auVar89 = vdpps_avx(_local_8a0,local_8c0._0_16_,0x7f);
                auVar5 = vfmadd213ss_fma(ZEXT416((uint)local_940._0_4_),auVar93,auVar242._0_16_);
                auVar200 = vdpps_avx(local_ac0._0_16_,local_8c0._0_16_,0x7f);
                auVar3 = vdpps_avx(_local_8a0,auVar161,0x7f);
                auVar4 = vdpps_avx(local_9a0._0_16_,local_8c0._0_16_,0x7f);
                auVar93 = vfmadd213ss_fma(ZEXT416((uint)(auVar93._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_940._0_4_ / fVar111)),auVar5);
                local_aa0._0_4_ = auVar93._0_4_;
                auVar94._0_4_ = auVar89._0_4_ * auVar89._0_4_;
                auVar94._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                auVar94._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                auVar94._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                auVar93 = vdpps_avx(_local_8a0,local_ac0._0_16_,0x7f);
                auVar6 = vsubps_avx(local_ae0._0_16_,auVar94);
                auVar5 = vrsqrtss_avx(auVar6,auVar6);
                fVar132 = auVar6._0_4_;
                fVar111 = auVar5._0_4_;
                fVar111 = fVar111 * 1.5 + fVar132 * -0.5 * fVar111 * fVar111 * fVar111;
                auVar5 = vdpps_avx(_local_8a0,local_9a0._0_16_,0x7f);
                local_ac0._0_16_ = ZEXT416((uint)(auVar200._0_4_ + auVar3._0_4_));
                local_8c0._0_16_ = vfnmadd231ss_fma(auVar93,auVar89,local_ac0._0_16_);
                auVar93 = vfnmadd231ss_fma(auVar5,auVar89,auVar4);
                if (fVar132 < 0.0) {
                  local_9c0._0_16_ = auVar89;
                  local_720._0_16_ = auVar4;
                  local_740._0_4_ = fVar111;
                  local_760._0_16_ = auVar93;
                  fVar132 = sqrtf(fVar132);
                  auVar242 = ZEXT464((uint)local_980._0_4_);
                  fVar111 = (float)local_740._0_4_;
                  auVar93 = local_760._0_16_;
                  auVar4 = local_720._0_16_;
                  auVar89 = local_9c0._0_16_;
                }
                else {
                  auVar200 = vsqrtss_avx(auVar6,auVar6);
                  fVar132 = auVar200._0_4_;
                }
                auVar234 = ZEXT3264(auVar225);
                auVar200 = vpermilps_avx(local_6e0._0_16_,0xff);
                fVar132 = fVar132 - auVar200._0_4_;
                auVar3 = vshufps_avx(local_960._0_16_,local_960._0_16_,0xff);
                auVar200 = vfmsub213ss_fma(local_8c0._0_16_,ZEXT416((uint)fVar111),auVar3);
                auVar162._0_8_ = auVar4._0_8_ ^ 0x8000000080000000;
                auVar162._8_4_ = auVar4._8_4_ ^ 0x80000000;
                auVar162._12_4_ = auVar4._12_4_ ^ 0x80000000;
                auVar184._0_8_ = auVar200._0_8_ ^ 0x8000000080000000;
                auVar184._8_4_ = auVar200._8_4_ ^ 0x80000000;
                auVar184._12_4_ = auVar200._12_4_ ^ 0x80000000;
                auVar93 = ZEXT416((uint)(auVar93._0_4_ * fVar111));
                auVar200 = vfmsub231ss_fma(ZEXT416((uint)(auVar4._0_4_ * auVar200._0_4_)),
                                           local_ac0._0_16_,auVar93);
                auVar93 = vinsertps_avx(auVar184,auVar93,0x1c);
                uVar84 = auVar200._0_4_;
                auVar185._4_4_ = uVar84;
                auVar185._0_4_ = uVar84;
                auVar185._8_4_ = uVar84;
                auVar185._12_4_ = uVar84;
                auVar93 = vdivps_avx(auVar93,auVar185);
                auVar200 = vinsertps_avx(local_ac0._0_16_,auVar162,0x10);
                auVar200 = vdivps_avx(auVar200,auVar185);
                fVar111 = auVar89._0_4_;
                auVar141._0_4_ = fVar111 * auVar93._0_4_ + fVar132 * auVar200._0_4_;
                auVar141._4_4_ = fVar111 * auVar93._4_4_ + fVar132 * auVar200._4_4_;
                auVar141._8_4_ = fVar111 * auVar93._8_4_ + fVar132 * auVar200._8_4_;
                auVar141._12_4_ = fVar111 * auVar93._12_4_ + fVar132 * auVar200._12_4_;
                auVar200 = vsubps_avx(auVar222,auVar141);
                auVar227 = ZEXT1664(auVar200);
                auVar93 = vandps_avx(auVar89,local_860);
                if (auVar93._0_4_ < (float)local_aa0._0_4_) {
                  auVar89 = vfmadd231ss_fma(ZEXT416((uint)(auVar242._0_4_ + (float)local_aa0._0_4_))
                                            ,local_780,ZEXT416(0x36000000));
                  auVar93 = vandps_avx(ZEXT416((uint)fVar132),local_860);
                  if (auVar93._0_4_ < auVar89._0_4_) {
                    fVar111 = auVar200._0_4_ + (float)local_840._0_4_;
                    bVar74 = 0;
                    if (fVar111 < (ray->org).field_0.m128[3]) goto LAB_01809537;
                    fVar132 = ray->tfar;
                    auVar242 = ZEXT464((uint)fVar132);
                    bVar74 = 0;
                    if (fVar132 < fVar111) goto LAB_01809537;
                    auVar93 = vmovshdup_avx(auVar200);
                    fVar133 = auVar93._0_4_;
                    auVar250 = ZEXT3264(local_920);
                    bVar74 = 0;
                    if ((fVar133 < 0.0) ||
                       (auVar258 = ZEXT3264(local_a80), bVar74 = 0, 1.0 < fVar133))
                    goto LAB_01809537;
                    auVar93 = vrsqrtss_avx(local_ae0._0_16_,local_ae0._0_16_);
                    fVar134 = auVar93._0_4_;
                    pGVar8 = (context->scene->geometries).items[uVar75].ptr;
                    if ((pGVar8->mask & ray->mask) == 0) {
                      bVar74 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar74 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      fVar134 = fVar134 * 1.5 + local_ae0._0_4_ * -0.5 * fVar134 * fVar134 * fVar134
                      ;
                      auVar163._0_4_ = fVar134 * (float)local_8a0._0_4_;
                      auVar163._4_4_ = fVar134 * (float)local_8a0._4_4_;
                      auVar163._8_4_ = fVar134 * fStack_898;
                      auVar163._12_4_ = fVar134 * fStack_894;
                      auVar3 = vfmadd213ps_fma(auVar3,auVar163,local_960._0_16_);
                      auVar93 = vshufps_avx(auVar163,auVar163,0xc9);
                      auVar89 = vshufps_avx(local_960._0_16_,local_960._0_16_,0xc9);
                      auVar164._0_4_ = auVar163._0_4_ * auVar89._0_4_;
                      auVar164._4_4_ = auVar163._4_4_ * auVar89._4_4_;
                      auVar164._8_4_ = auVar163._8_4_ * auVar89._8_4_;
                      auVar164._12_4_ = auVar163._12_4_ * auVar89._12_4_;
                      auVar222 = vfmsub231ps_fma(auVar164,local_960._0_16_,auVar93);
                      auVar93 = vshufps_avx(auVar222,auVar222,0xc9);
                      auVar89 = vshufps_avx(auVar3,auVar3,0xc9);
                      auVar222 = vshufps_avx(auVar222,auVar222,0xd2);
                      auVar95._0_4_ = auVar3._0_4_ * auVar222._0_4_;
                      auVar95._4_4_ = auVar3._4_4_ * auVar222._4_4_;
                      auVar95._8_4_ = auVar3._8_4_ * auVar222._8_4_;
                      auVar95._12_4_ = auVar3._12_4_ * auVar222._12_4_;
                      auVar89 = vfmsub231ps_fma(auVar95,auVar93,auVar89);
                      auVar93 = vshufps_avx(auVar89,auVar89,0xe9);
                      local_900 = vmovlps_avx(auVar93);
                      local_8f8 = auVar89._0_4_;
                      local_8f0 = 0;
                      local_8ec = (undefined4)local_8c8;
                      local_8e4 = context->user->instID[0];
                      local_8e0 = context->user->instPrimID[0];
                      ray->tfar = fVar111;
                      local_ae4 = -1;
                      local_a10.valid = &local_ae4;
                      local_a10.geometryUserPtr = pGVar8->userPtr;
                      local_a10.context = context->user;
                      local_a10.hit = (RTCHitN *)&local_900;
                      local_a10.N = 1;
                      local_a10.ray = (RTCRayN *)ray;
                      local_8f4 = fVar133;
                      local_8e8 = uVar75;
                      if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01809762:
                        p_Var9 = context->args->filter;
                        if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar227 = ZEXT1664(auVar227._0_16_);
                          auVar234 = ZEXT1664(auVar234._0_16_);
                          auVar242 = ZEXT1664(auVar242._0_16_);
                          (*p_Var9)(&local_a10);
                          if (*local_a10.valid == 0) goto LAB_018097af;
                        }
                        bVar74 = 1;
                      }
                      else {
                        auVar227 = ZEXT1664(auVar200);
                        auVar234 = ZEXT1664(auVar221);
                        auVar242 = ZEXT464((uint)fVar132);
                        (*pGVar8->occlusionFilterN)(&local_a10);
                        if (*local_a10.valid != 0) goto LAB_01809762;
LAB_018097af:
                        ray->tfar = fVar132;
                        bVar74 = 0;
                      }
                      auVar258 = ZEXT3264(local_a80);
                      auVar250 = ZEXT3264(local_920);
                    }
                    goto LAB_0180953b;
                  }
                }
                bVar83 = uVar79 < 4;
                uVar79 = uVar79 + 1;
              } while (uVar79 != 5);
              bVar83 = false;
              bVar74 = 5;
LAB_01809537:
              auVar258 = ZEXT3264(local_a80);
              auVar250 = ZEXT3264(local_920);
LAB_0180953b:
              bVar80 = (bool)(bVar80 | bVar83 & bVar74);
              fVar111 = ray->tfar;
              auVar102._4_4_ = fVar111;
              auVar102._0_4_ = fVar111;
              auVar102._8_4_ = fVar111;
              auVar102._12_4_ = fVar111;
              auVar102._16_4_ = fVar111;
              auVar102._20_4_ = fVar111;
              auVar102._24_4_ = fVar111;
              auVar102._28_4_ = fVar111;
              auVar261 = vcmpps_avx(_local_7e0,auVar102,2);
              auVar97 = vandps_avx(auVar261,local_6c0);
              auVar261 = local_6c0 & auVar261;
              local_6c0 = auVar97;
            } while ((((((((auVar261 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar261 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar261 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar261 >> 0x7f,0) != '\0') ||
                       (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar261 >> 0xbf,0) != '\0') ||
                     (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar261[0x1f] < '\0');
          }
          auVar150._0_4_ = (float)local_880._0_4_ + local_460._0_4_;
          auVar150._4_4_ = (float)local_880._4_4_ + local_460._4_4_;
          auVar150._8_4_ = fStack_878 + local_460._8_4_;
          auVar150._12_4_ = fStack_874 + local_460._12_4_;
          auVar150._16_4_ = fStack_870 + local_460._16_4_;
          auVar150._20_4_ = fStack_86c + local_460._20_4_;
          auVar150._24_4_ = fStack_868 + local_460._24_4_;
          auVar150._28_4_ = fStack_864 + local_460._28_4_;
          auVar261 = vcmpps_avx(auVar150,auVar102,2);
          auVar97 = vandps_avx(local_560,local_540);
          auVar97 = vandps_avx(auVar261,auVar97);
          auVar174._0_4_ = (float)local_880._0_4_ + local_4a0._0_4_;
          auVar174._4_4_ = (float)local_880._4_4_ + local_4a0._4_4_;
          auVar174._8_4_ = fStack_878 + local_4a0._8_4_;
          auVar174._12_4_ = fStack_874 + local_4a0._12_4_;
          auVar174._16_4_ = fStack_870 + local_4a0._16_4_;
          auVar174._20_4_ = fStack_86c + local_4a0._20_4_;
          auVar174._24_4_ = fStack_868 + local_4a0._24_4_;
          auVar174._28_4_ = fStack_864 + local_4a0._28_4_;
          auVar145 = vcmpps_avx(auVar174,auVar102,2);
          auVar261 = vandps_avx(_local_820,local_800);
          auVar261 = vandps_avx(auVar145,auVar261);
          auVar261 = vorps_avx(auVar97,auVar261);
          if ((((((((auVar261 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar261 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar261 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar261 >> 0x7f,0) != '\0') ||
                (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar261 >> 0xbf,0) != '\0') ||
              (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar261[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar82 * 0x60) = auVar261;
            auVar97 = vblendvps_avx(local_4a0,local_460,auVar97);
            *(undefined1 (*) [32])(auStack_160 + uVar82 * 0x60) = auVar97;
            uVar85 = vmovlps_avx(local_4b0);
            (&uStack_140)[uVar82 * 0xc] = uVar85;
            aiStack_138[uVar82 * 0x18] = local_b64 + 1;
            iVar81 = iVar81 + 1;
          }
        }
      }
    }
    auVar261 = local_400;
    fVar111 = ray->tfar;
    auVar105._4_4_ = fVar111;
    auVar105._0_4_ = fVar111;
    auVar105._8_4_ = fVar111;
    auVar105._12_4_ = fVar111;
    auVar105._16_4_ = fVar111;
    auVar105._20_4_ = fVar111;
    auVar105._24_4_ = fVar111;
    auVar105._28_4_ = fVar111;
    if (iVar81 == 0) break;
    uVar77 = -iVar81;
    pauVar76 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar81 - 1) * 0x60);
    fVar111 = (float)local_880._0_4_;
    fVar132 = (float)local_880._4_4_;
    fVar133 = fStack_878;
    fVar134 = fStack_874;
    fVar137 = fStack_870;
    fVar135 = fStack_86c;
    fVar136 = fStack_868;
    fVar194 = fStack_864;
    while( true ) {
      auVar97 = pauVar76[1];
      auVar128._0_4_ = fVar111 + auVar97._0_4_;
      auVar128._4_4_ = fVar132 + auVar97._4_4_;
      auVar128._8_4_ = fVar133 + auVar97._8_4_;
      auVar128._12_4_ = fVar134 + auVar97._12_4_;
      auVar128._16_4_ = fVar137 + auVar97._16_4_;
      auVar128._20_4_ = fVar135 + auVar97._20_4_;
      auVar128._24_4_ = fVar136 + auVar97._24_4_;
      auVar128._28_4_ = fVar194 + auVar97._28_4_;
      auVar13 = vcmpps_avx(auVar128,auVar105,2);
      auVar145 = vandps_avx(auVar13,*pauVar76);
      local_460 = auVar145;
      auVar13 = *pauVar76 & auVar13;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0x7f,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0xbf,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar13[0x1f] < '\0') break;
      pauVar76 = pauVar76 + -3;
      uVar77 = uVar77 + 1;
      fVar111 = (float)local_880._0_4_;
      fVar132 = (float)local_880._4_4_;
      fVar133 = fStack_878;
      fVar134 = fStack_874;
      fVar137 = fStack_870;
      fVar135 = fStack_86c;
      fVar136 = fStack_868;
      fVar194 = fStack_864;
      if (uVar77 == 0) goto LAB_01809ab5;
    }
    auVar106._8_4_ = 0x7f800000;
    auVar106._0_8_ = 0x7f8000007f800000;
    auVar106._12_4_ = 0x7f800000;
    auVar106._16_4_ = 0x7f800000;
    auVar106._20_4_ = 0x7f800000;
    auVar106._24_4_ = 0x7f800000;
    auVar106._28_4_ = 0x7f800000;
    auVar97 = vblendvps_avx(auVar106,auVar97,auVar145);
    auVar13 = vshufps_avx(auVar97,auVar97,0xb1);
    auVar13 = vminps_avx(auVar97,auVar13);
    auVar14 = vshufpd_avx(auVar13,auVar13,5);
    auVar13 = vminps_avx(auVar13,auVar14);
    auVar14 = vpermpd_avx2(auVar13,0x4e);
    auVar13 = vminps_avx(auVar13,auVar14);
    auVar97 = vcmpps_avx(auVar97,auVar13,0);
    auVar13 = auVar145 & auVar97;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar145 = vandps_avx(auVar97,auVar145);
    }
    uVar79 = *(ulong *)pauVar76[2];
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar79;
    uVar78 = vmovmskps_avx(auVar145);
    iVar81 = 0;
    for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
      iVar81 = iVar81 + 1;
    }
    *(undefined4 *)(local_460 + (uint)(iVar81 << 2)) = 0;
    uVar78 = ~uVar77;
    if ((((((((local_460 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_460 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_460 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_460 >> 0x7f,0) != '\0') ||
          (local_460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_460 >> 0xbf,0) != '\0') ||
        (local_460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_460[0x1f] < '\0') {
      uVar78 = -uVar77;
    }
    uVar82 = (ulong)uVar78;
    local_b64 = *(int *)(pauVar76[2] + 8);
    *pauVar76 = local_460;
    uVar84 = (undefined4)uVar79;
    auVar129._4_4_ = uVar84;
    auVar129._0_4_ = uVar84;
    auVar129._8_4_ = uVar84;
    auVar129._12_4_ = uVar84;
    auVar129._16_4_ = uVar84;
    auVar129._20_4_ = uVar84;
    auVar129._24_4_ = uVar84;
    auVar129._28_4_ = uVar84;
    auVar93 = vmovshdup_avx(auVar96);
    auVar93 = vsubps_avx(auVar93,auVar96);
    auVar107._0_4_ = auVar93._0_4_;
    auVar107._4_4_ = auVar107._0_4_;
    auVar107._8_4_ = auVar107._0_4_;
    auVar107._12_4_ = auVar107._0_4_;
    auVar107._16_4_ = auVar107._0_4_;
    auVar107._20_4_ = auVar107._0_4_;
    auVar107._24_4_ = auVar107._0_4_;
    auVar107._28_4_ = auVar107._0_4_;
    auVar93 = vfmadd132ps_fma(auVar107,auVar129,_DAT_01faff20);
    local_4a0 = ZEXT1632(auVar93);
    local_4b0._8_8_ = 0;
    local_4b0._0_8_ = *(ulong *)(local_4a0 + (uint)(iVar81 << 2));
  } while( true );
LAB_01809ab5:
  if (bVar80 != false) {
    return bVar80;
  }
  auVar97 = vcmpps_avx(local_340,auVar105,2);
  uVar75 = vmovmskps_avx(auVar97);
  uVar75 = (uint)local_828 & uVar75;
  if (uVar75 == 0) {
    return false;
  }
  goto LAB_0180756c;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }